

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::RALocalAllocator::replaceAssignment
          (RALocalAllocator *this,PhysToWorkMap *physToWorkMap)

{
  int *piVar1;
  byte *pbVar2;
  uint **ppuVar3;
  uint **ppuVar4;
  byte bVar5;
  InstHints IVar6;
  BaseNode *node;
  WorkToPhysMap *pWVar7;
  BaseCompiler *pBVar8;
  PhysToWorkMap *pPVar9;
  uint *puVar10;
  uint *puVar11;
  Layout *pLVar12;
  RAAssignment *pRVar13;
  undefined4 workId;
  undefined8 uVar14;
  RegGroup RVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint32_t uVar19;
  Error EVar20;
  long lVar21;
  RALocalAllocator *pRVar22;
  RAStackSlot *pRVar23;
  RALocalAllocator *pRVar24;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  RABlock *pRVar25;
  RALocalAllocator *pRVar26;
  RALocalAllocator *pRVar27;
  RALocalAllocator *pRVar28;
  RALocalAllocator *pRVar29;
  ulong uVar30;
  uint uVar31;
  uint extraout_EDX;
  uint extraout_EDX_00;
  long *extraout_RDX;
  RABlock *block;
  RALocalAllocator *pRVar32;
  PhysToWorkMap *pPVar33;
  ulong unaff_RBP;
  RALocalAllocator *pRVar34;
  uint *puVar35;
  int iVar36;
  RALocalAllocator *pRVar37;
  RALocalAllocator *pRVar38;
  InstNode *node_00;
  RALocalAllocator *pRVar39;
  ulong uVar40;
  RALocalAllocator *pRVar41;
  uint uVar42;
  RALocalAllocator *pRVar43;
  RALocalAllocator *pRVar44;
  RALocalAllocator *unaff_R12;
  uint uVar45;
  uint uVar46;
  ulong unaff_R13;
  RALocalAllocator *unaff_R14;
  RALocalAllocator *pRVar47;
  RALocalAllocator *pRVar48;
  int iVar49;
  RALocalAllocator *unaff_R15;
  ulong uVar50;
  undefined7 uVar53;
  RALocalAllocator *pRVar51;
  InstNode *pIVar52;
  byte bVar54;
  bool bVar55;
  char cVar56;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  PhysToWorkMap *pPStack_4d0;
  RALocalAllocator *pRStack_4c8;
  RALocalAllocator *pRStack_4c0;
  RALocalAllocator *pRStack_4b8;
  InstNode *pIStack_4b0;
  uint *puStack_4a8;
  Error EStack_49c;
  ulong uStack_498;
  RALocalAllocator *pRStack_490;
  InstNode *pIStack_488;
  RALocalAllocator *pRStack_480;
  RALocalAllocator *pRStack_478;
  RALocalAllocator *pRStack_470;
  RALocalAllocator *pRStack_468;
  RALocalAllocator *pRStack_460;
  RALocalAllocator *pRStack_458;
  RALocalAllocator *pRStack_450;
  RALocalAllocator *pRStack_448;
  RALocalAllocator *pRStack_440;
  RALocalAllocator *pRStack_438;
  RALocalAllocator *pRStack_430;
  RALocalAllocator *pRStack_428;
  code *pcStack_420;
  code *pcStack_418;
  uint uStack_40c;
  RALocalAllocator *pRStack_408;
  RALocalAllocator *pRStack_400;
  RALocalAllocator *pRStack_3f8;
  uint uStack_3ec;
  undefined8 uStack_3e8;
  RALocalAllocator *pRStack_3e0;
  uint uStack_3d8;
  uint uStack_3d4;
  RALocalAllocator *pRStack_3d0;
  RALocalAllocator *pRStack_3c8;
  uint uStack_3c0;
  uint uStack_3bc;
  RALocalAllocator *pRStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  uint uStack_39c;
  RALocalAllocator *pRStack_398;
  ulong uStack_390;
  RALocalAllocator *pRStack_388;
  undefined1 auStack_380 [48];
  RALocalAllocator *pRStack_350;
  uint **ppuStack_348;
  undefined8 auStack_340 [32];
  undefined8 auStack_240 [33];
  RALocalAllocator *pRStack_138;
  ulong uStack_130;
  ulong uStack_128;
  RALocalAllocator *pRStack_120;
  RALocalAllocator *pRStack_118;
  ulong uStack_110;
  RALocalAllocator *pRStack_108;
  RALocalAllocator *pRStack_100;
  RALocalAllocator *pRStack_f8;
  ulong uStack_f0;
  RALocalAllocator *pRStack_e8;
  RALocalAllocator *pRStack_e0;
  ulong uStack_d8;
  uint uStack_c4;
  RALocalAllocator *pRStack_c0;
  RALocalAllocator *pRStack_b8;
  uint uStack_ac;
  RALocalAllocator *pRStack_a8;
  uint uStack_9c;
  ulong uStack_98;
  long *plStack_90;
  undefined4 uStack_84;
  undefined1 auStack_80 [24];
  RALocalAllocator *pRStack_68;
  RALocalAllocator *pRStack_60;
  ulong uStack_58;
  uint auStack_50 [6];
  RALocalAllocator *pRStack_38;
  
  memcpy((this->_curAssignment)._physToWorkMap,physToWorkMap,
         (ulong)(this->_curAssignment)._layout.physTotal * 4 + 0x20);
  memset((this->_curAssignment)._workToPhysMap,0xff,(ulong)(this->_curAssignment)._layout.workCount)
  ;
  lVar21 = 0;
  uStack_84 = 0xffffffff;
  while (uVar42 = (((this->_curAssignment)._physToWorkMap)->assigned)._masks._data[lVar21],
        uVar42 == 0) {
LAB_00122d1b:
    lVar21 = lVar21 + 1;
    if (lVar21 == 4) {
      return 0;
    }
  }
  bVar54 = *(byte *)((long)(this->_curAssignment)._physToWorkIds._data + lVar21 + -0x28);
  pRVar29 = (RALocalAllocator *)(ulong)bVar54;
  while( true ) {
    uVar16 = 0;
    if (uVar42 != 0) {
      for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
    }
    pRVar41 = (RALocalAllocator *)(ulong)uVar16;
    uVar18 = ((this->_curAssignment)._physToWorkMap)->workIds[uVar16 + bVar54];
    if ((ulong)uVar18 == 0xffffffff) break;
    (this->_curAssignment)._workToPhysMap[uVar18].physIds[0] = (uint8_t)uVar16;
    uVar42 = uVar42 - 1 & uVar42;
    if (uVar42 == 0) goto LAB_00122d1b;
  }
  replaceAssignment();
  auStack_50[0] = 0;
  auStack_50[1] = 0;
  auStack_50[2] = 0;
  auStack_50[3] = 0;
  pRStack_60 = (RALocalAllocator *)0x0;
  uStack_58 = 0;
  auStack_80._16_8_ = (ArchTraits *)0x0;
  pRStack_68 = (RALocalAllocator *)0x0;
  auStack_80._0_8_ = (BaseRAPass *)0x0;
  auStack_80._8_8_ = (BaseCompiler *)0x0;
  auStack_50[4] = 0;
  auStack_50[5] = 0;
  lVar21 = *(long *)&pRVar41->_pass;
  uVar42 = (uint)*(byte *)(lVar21 + 0x10d) + (uint)*(byte *)(lVar21 + 0x10c);
  pRVar24 = (RALocalAllocator *)(ulong)uVar42;
  pRVar26 = this;
  uStack_9c = uVar18;
  pRStack_38 = this;
  if (0xff < uVar42) goto LAB_0012360a;
  uVar16 = *(byte *)(lVar21 + 0x10e) + uVar42;
  if (0xff < uVar16) goto LAB_0012360f;
  pRStack_a8 = (RALocalAllocator *)&pRVar41->_curAssignment;
  auStack_80._16_8_ = lVar21 + 0x140;
  auStack_80._0_4_ = uVar16 * 0x1000000 | uVar42 * 0x10000 | (uint)*(byte *)(lVar21 + 0x10c) << 8;
  auStack_80._4_4_ = *(uint *)(lVar21 + 0x10c);
  auStack_80._12_4_ = *(uint *)(lVar21 + 0x148);
  auStack_80._8_4_ = (*(uint *)(lVar21 + 0x10c) >> 0x18) + ((uint)auStack_80._0_4_ >> 0x18);
  pRVar38 = (RALocalAllocator *)pRVar41->_tmpWorkToPhysMap;
  lVar21 = 0;
  do {
    uVar40 = (long)(pRVar29->_availableRegs)._masks._data +
             ((ulong)((uint)auStack_80._0_4_ >> ((byte)lVar21 & 0x1f) & 0xff) + 2) * 4;
    *(ulong *)((long)&uStack_58 + lVar21) = uVar40;
    lVar21 = lVar21 + 8;
  } while (lVar21 != 0x20);
  pRVar37 = (RALocalAllocator *)0xff;
  uStack_d8 = 0x122e57;
  pRStack_c0 = pRVar41;
  plStack_90 = extraout_RDX;
  pRStack_68 = pRVar38;
  pRStack_60 = pRVar29;
  memset(pRVar38,0xff,(ulong)(uint)auStack_80._12_4_);
  lVar21 = 0;
LAB_00122e5e:
  uVar42 = *(uint *)((long)(pRStack_60->_availableRegs)._masks._data + (lVar21 + -6) * 4);
  if (uVar42 == 0) goto LAB_00122e9e;
  bVar54 = auStack_80[lVar21];
  pRVar37 = (RALocalAllocator *)(ulong)bVar54;
  while( true ) {
    uVar16 = 0;
    if (uVar42 != 0) {
      for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
    }
    pRVar38 = (RALocalAllocator *)(ulong)uVar16;
    pRVar24 = (RALocalAllocator *)(ulong)(uVar16 + bVar54);
    uVar40 = (ulong)*(uint *)((long)(pRStack_60->_availableRegs)._masks._data +
                             (long)((long)&(((Layout *)&pRVar24->_pass)->physIndex).super_RARegCount
                                           .field_0 + 2) * 4);
    if (uVar40 == 0xffffffff) break;
    *(char *)((long)(pRStack_68->_availableRegs)._masks._data + (uVar40 - 0x18)) = (char)uVar16;
    uVar42 = uVar42 - 1 & uVar42;
    if (uVar42 == 0) goto LAB_00122e9e;
  }
  uStack_d8 = 0x1235b5;
  switchToAssignment();
LAB_001235b5:
  uStack_d8 = 0x1235ba;
  switchToAssignment();
LAB_001235ba:
  uStack_d8 = 0x1235bf;
  switchToAssignment();
  pRVar26 = unaff_R14;
LAB_001235bf:
  uStack_d8 = 0x1235c4;
  switchToAssignment();
LAB_001235c4:
  uStack_d8 = 0x1235c9;
  switchToAssignment();
  pRVar41 = pRVar38;
  unaff_R14 = pRVar26;
LAB_001235c9:
  uStack_d8 = 0x1235ce;
  switchToAssignment();
  pRVar38 = pRVar41;
  pRVar26 = unaff_R12;
LAB_001235ce:
  uStack_d8 = 0x1235d3;
  switchToAssignment();
LAB_001235d3:
  uStack_d8 = 0x1235d8;
  switchToAssignment();
  pRVar41 = pRVar38;
  unaff_R12 = pRVar26;
LAB_001235d8:
  uStack_d8 = 0x1235dd;
  switchToAssignment();
LAB_001235dd:
  uStack_d8 = 0x1235e2;
  switchToAssignment();
LAB_001235e2:
  uStack_d8 = 0x1235e7;
  switchToAssignment();
  pRVar38 = pRVar41;
LAB_001235e7:
  uStack_d8 = 0x1235ec;
  switchToAssignment();
LAB_001235ec:
  uStack_d8 = 0x1235f1;
  switchToAssignment();
LAB_001235f1:
  uStack_d8 = 0x1235f6;
  switchToAssignment();
LAB_001235f6:
  pRVar26 = this;
  uStack_d8 = 0x1235fb;
  switchToAssignment();
LAB_001235fb:
  uStack_d8 = 0x123600;
  switchToAssignment();
  uStack_d8 = 0x123605;
  switchToAssignment();
  uStack_d8 = 0x12360a;
  switchToAssignment();
  pRVar29 = pRVar37;
  pRVar41 = pRVar38;
LAB_0012360a:
  uStack_d8 = 0x12360f;
  switchToAssignment();
  this = pRVar26;
LAB_0012360f:
  uVar42 = (uint)pRVar29;
  uStack_d8 = 0x123614;
  switchToAssignment();
  goto LAB_00123614;
LAB_00122e9e:
  lVar21 = lVar21 + 1;
  if (lVar21 == 4) goto code_r0x00122ea7;
  goto LAB_00122e5e;
code_r0x00122ea7:
  pRVar24 = (RALocalAllocator *)0x0;
  pRVar29 = pRStack_c0;
LAB_00122eb5:
  pRStack_b8 = pRVar24;
  if ((byte)uStack_9c == '\0') {
    uVar42 = (((pRVar29->_curAssignment)._physToWorkMap)->assigned)._masks._data[(long)pRVar24];
    unaff_R14 = (RALocalAllocator *)(ulong)uVar42;
    unaff_R15 = (RALocalAllocator *)CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
    if (uVar42 == 0) {
      bVar55 = true;
    }
    else {
      do {
        uVar42 = 0;
        uVar16 = (uint)unaff_R14;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
          }
        }
        this = (RALocalAllocator *)(ulong)uVar42;
        uVar18 = (pRVar29->_curAssignment)._physToWorkIds._data[(long)pRVar24][(long)this];
        unaff_R12 = (RALocalAllocator *)(ulong)uVar18;
        pRVar41 = pRVar38;
        if (unaff_R12 == (RALocalAllocator *)0xffffffff) goto LAB_001235dd;
        if (*(uint *)(plStack_90 + 1) <= uVar18) goto LAB_001235e2;
        unaff_RBP = uVar40 & 0xffffffff;
        uVar40 = unaff_RBP;
        if ((*(ulong *)(*plStack_90 + (ulong)(uVar18 >> 6) * 8) >> ((ulong)unaff_R12 & 0x3f) & 1) ==
            0) {
          pRVar37 = (RALocalAllocator *)((ulong)pRVar24 & 0xff);
          uStack_d8 = 0x122fa6;
          pRVar38 = pRStack_a8;
          RAAssignment::unassign((RAAssignment *)pRStack_a8,(RegGroup)pRVar24,uVar18,uVar42);
          bVar54 = 4;
          pRVar24 = pRStack_b8;
          pRVar29 = pRStack_c0;
        }
        else {
          if ((uint)auStack_80._12_4_ <= uVar18) goto LAB_001235e7;
          bVar54 = 0;
          if (*(char *)((long)(pRStack_68->_availableRegs)._masks._data +
                       (long)&unaff_R12[-1]._raInst) != -1) goto LAB_00122fbe;
          if (((((pRVar29->_curAssignment)._physToWorkMap)->dirty)._masks._data[(long)pRVar24] >>
               (uVar42 & 0x1f) & 1) == 0) {
LAB_00122f5e:
            pRVar37 = (RALocalAllocator *)((ulong)pRVar24 & 0xff);
            uStack_d8 = 0x122f71;
            pRVar29 = pRStack_a8;
            RAAssignment::unassign((RAAssignment *)pRStack_a8,(RegGroup)pRVar24,uVar18,uVar42);
            uVar17 = 0;
          }
          else {
            pRVar37 = (RALocalAllocator *)((ulong)pRVar24 & 0xff);
            uStack_d8 = 0x122f50;
            uVar17 = onSaveReg(pRVar29,(RegGroup)pRVar24,uVar18,uVar42);
            pRVar24 = pRStack_b8;
            if (uVar17 == 0) goto LAB_00122f5e;
          }
          bVar54 = uVar17 != 0;
          pRVar38 = pRVar29;
          pRVar24 = pRStack_b8;
          pRVar29 = pRStack_c0;
          if ((bool)bVar54) {
            uVar40 = (ulong)uVar17;
          }
        }
LAB_00122fbe:
        if ((bVar54 & 3) != 0) goto LAB_00122fd5;
        uVar16 = uVar16 - 1 & uVar16;
        unaff_R14 = (RALocalAllocator *)(ulong)uVar16;
      } while (uVar16 != 0);
      bVar54 = 0;
LAB_00122fd5:
      bVar55 = bVar54 == 0;
    }
    if (bVar55) goto LAB_00122fe6;
  }
  else {
LAB_00122fe6:
    unaff_R14 = (RALocalAllocator *)
                (ulong)*(uint *)((long)(pRStack_60->_availableRegs)._masks._data +
                                (long)((long)&pRVar24[-1]._tmpWorkToPhysMap + 2) * 4);
    pRVar37 = (RALocalAllocator *)0xffffffff;
    uVar30 = 0;
    do {
      if ((int)unaff_R14 == 0) {
LAB_0012342f:
        uStack_ac = (uint)pRVar24 & 0xff;
        pRVar26 = pRVar29;
        goto LAB_00123437;
      }
      uVar42 = (int)pRVar37 + 1;
      pRVar37 = (RALocalAllocator *)(ulong)uVar42;
      if (uVar42 == 2) {
        if ((byte)uStack_9c != '\0') goto LAB_0012342f;
        uVar40 = 3;
        break;
      }
      uStack_98 = uVar30;
      unaff_R15 = unaff_R14;
      do {
        uVar18 = (uint)pRVar37;
        uVar42 = 0;
        uVar16 = (uint)unaff_R15;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
          }
        }
        this = (RALocalAllocator *)(ulong)uVar42;
        uVar45 = 1 << ((byte)uVar42 & 0x1f);
        unaff_R13 = (ulong)uVar45;
        uVar17 = *(uint *)((&uStack_58)[(long)pRVar24] + (ulong)(uVar42 * 4));
        unaff_RBP = (ulong)uVar17;
        if (unaff_RBP == 0xffffffff) goto LAB_001235b5;
        uVar46 = *(uint *)((long)(pRVar29->_curAssignment)._physToWorkIds._data[(long)pRVar24] +
                          (ulong)(uVar42 * 4));
        unaff_R12 = (RALocalAllocator *)(ulong)uVar46;
        pRVar26 = unaff_R14;
        if (uVar46 == 0xffffffff) {
LAB_0012324b:
          if ((pRVar29->_curAssignment)._layout.workCount <= uVar17) goto LAB_001235c4;
          bVar54 = (pRVar29->_curAssignment)._workToPhysMap[unaff_RBP].physIds[0];
          unaff_R14 = (RALocalAllocator *)(ulong)bVar54;
          if (bVar54 == 0xff) {
            if (*(uint *)(plStack_90 + 1) <= uVar17) goto LAB_001235d3;
            uVar18 = 0;
            if ((*(ulong *)(*plStack_90 + (ulong)(uVar17 >> 6) * 8) >> (unaff_RBP & 0x3f) & 1) != 0)
            {
              uVar18 = uVar45;
            }
            uStack_98 = (ulong)((uint)uStack_98 | uVar18);
            cVar56 = '\f';
            unaff_R14 = (RALocalAllocator *)(ulong)((uint)pRVar26 & ~uVar45);
          }
          else {
            uVar18 = 0;
            if (uVar42 != bVar54) {
              uStack_ac = (uint)pRVar37;
              uStack_c4 = (uint)uVar40;
              uStack_d8 = 0x12328f;
              RAAssignment::reassign
                        ((RAAssignment *)pRStack_a8,(RegGroup)pRVar24,uVar17,uVar42,(uint)bVar54);
              pRVar38 = *(RALocalAllocator **)&pRStack_c0->_pass;
              uStack_d8 = 0x1232a4;
              uVar18 = (**(code **)(*(long *)&pRVar38->_pass + 0x48))(pRVar38,uVar17,uVar42,bVar54);
              pRVar37 = (RALocalAllocator *)(ulong)uStack_ac;
              uVar40 = (ulong)uStack_c4;
              pRVar24 = pRStack_b8;
              pRVar29 = pRStack_c0;
            }
            cVar56 = uVar18 != 0;
            uVar40 = uVar40 & 0xffffffff;
            unaff_R14 = pRVar26;
            if ((bool)cVar56) {
              uVar40 = (ulong)uVar18;
            }
          }
          uVar18 = (uint)pRVar37;
          unaff_R12 = pRVar26;
          if (cVar56 != '\0') goto LAB_001233f7;
LAB_00123322:
          pRVar38 = pRVar29;
          unaff_R12 = (RALocalAllocator *)(ulong)uVar18;
          uVar18 = *(uint *)((long)(&pRStack_60->_availableRegs + -1) + (long)pRVar24 * 4 + 8);
          pRVar37 = (RALocalAllocator *)(pRVar38->_curAssignment)._physToWorkMap;
          uVar46 = *(uint *)((long)(&pRVar37->_availableRegs + -1) + (long)pRVar24 * 4 + 8);
          pRVar41 = (RALocalAllocator *)(ulong)(uVar46 ^ uVar18);
          pRVar29 = pRVar38;
          if (((uVar46 ^ uVar18) & uVar45) != 0) {
            if ((uVar18 & uVar45) == 0) {
              if ((uVar46 & uVar45) == 0) goto LAB_001235d8;
              if ((char)uStack_84 != '\0') {
                pRVar37 = (RALocalAllocator *)((ulong)pRVar24 & 0xff);
                unaff_RBP = uVar40 & 0xffffffff;
                uStack_d8 = 0x12337e;
                EVar20 = onSaveReg(pRVar38,(RegGroup)pRVar24,uVar17,uVar42);
                uVar40 = uVar40 & 0xffffffff;
                cVar56 = '\x01';
                pRVar41 = pRVar38;
                pRVar24 = pRStack_b8;
                pRVar29 = pRStack_c0;
                if (EVar20 != 0) {
                  uVar40 = (ulong)EVar20;
                  pRVar37 = unaff_R12;
                  goto LAB_001233f7;
                }
                goto LAB_001233b0;
              }
              lVar21 = (long)(pRStack_60->_availableRegs)._masks._data +
                       (long)((long)&pRVar24[-1]._tmpWorkToPhysMap + 2) * 4;
            }
            else {
              if ((uVar46 & uVar45) != 0) goto LAB_001235c9;
              lVar21 = (long)(pRVar37->_availableRegs)._masks._data +
                       (long)((long)&pRVar24[-1]._tmpWorkToPhysMap + 2) * 4;
              uVar18 = uVar46;
            }
            *(uint *)(lVar21 + 0x10) = uVar18 | uVar45;
          }
LAB_001233b0:
          pRVar38 = pRVar41;
          this = (RALocalAllocator *)(ulong)(uVar42 << 2);
          if (*(int *)((long)(this->_availableRegs)._masks._data +
                      ((&uStack_58)[(long)pRVar24] - 0x18)) !=
              *(int *)((long)(this->_availableRegs)._masks._data +
                      (long)((pRVar29->_curAssignment)._physToWorkIds._data[(long)pRVar24] + -6)))
          goto LAB_001235ba;
          pRVar26 = unaff_R14;
          if (((*(uint *)((long)(&pRStack_60->_availableRegs + -1) + (long)pRVar24 * 4 + 8) & uVar45
               ) != 0) !=
              (((((pRVar29->_curAssignment)._physToWorkMap)->dirty)._masks._data[(long)pRVar24] &
               uVar45) != 0)) goto LAB_001235bf;
          unaff_R13 = (ulong)~uVar45;
          unaff_R14 = (RALocalAllocator *)(ulong)((uint)unaff_R14 & ~uVar45);
          cVar56 = '\0';
          pRVar37 = (RALocalAllocator *)0xffffffff;
        }
        else {
          if (uVar46 == uVar17) goto LAB_00123322;
          if ((int)uVar18 < 1) {
            cVar56 = '\f';
          }
          else {
            pRVar26 = unaff_R12;
            if ((pRVar29->_curAssignment)._layout.workCount <= uVar17) goto LAB_001235ce;
            uStack_ac = (uint)unaff_R14;
            bVar54 = (pRVar29->_curAssignment)._workToPhysMap[unaff_RBP].physIds[0];
            if (bVar54 == 0xff) {
              cVar56 = '\f';
            }
            else {
              uStack_c4 = (uint)uVar40;
              RVar15 = (RegGroup)pRVar24;
              if (((byte)*(RAWorkRegs *)
                          ((long)((long)(&pRVar24->_availableRegs + -1) + 8) +
                          (long)pRVar29->_archTraits) & 1) == 0) {
                pPVar33 = (pRVar29->_curAssignment)._physToWorkMap;
                if (((pPVar33->dirty)._masks._data[(long)pRVar24] & uVar45) == 0) {
                  uStack_d8 = 0x1231bd;
                  pRVar38 = pRStack_a8;
                  RAAssignment::unassign((RAAssignment *)pRStack_a8,RVar15,uVar46,uVar42);
                  cVar56 = '\x18';
                  uVar40 = (ulong)uStack_c4;
                }
                else {
                  uVar31 = ~(pPVar33->assigned)._masks._data[(long)pRVar24] &
                           *(uint *)(*(long *)&pRVar29->_pass + 0x118 + (long)pRVar24 * 4);
                  uVar18 = ~*(uint *)((long)(pRStack_60->_availableRegs)._masks._data +
                                     (long)((long)&pRVar24[-1]._tmpWorkToPhysMap + 2) * 4) & uVar31;
                  if (uVar18 == 0) {
                    uVar18 = uVar31;
                  }
                  if (uVar18 == 0) {
                    if (((((pRVar29->_curAssignment)._physToWorkMap)->dirty)._masks._data
                         [(long)pRVar24] & uVar45) == 0) {
LAB_001231f3:
                      uStack_d8 = 0x123206;
                      pRVar38 = pRStack_a8;
                      RAAssignment::unassign((RAAssignment *)pRStack_a8,RVar15,uVar46,uVar42);
                      uVar18 = 0;
                    }
                    else {
                      uStack_d8 = 0x1231ef;
                      pRVar38 = pRStack_c0;
                      uVar18 = onSaveReg(pRStack_c0,RVar15,uVar46,uVar42);
                      if (uVar18 == 0) goto LAB_001231f3;
                    }
                    uVar46 = uStack_c4;
                    if (uVar18 != 0) {
                      uVar46 = uVar18;
                    }
                    uVar40 = (ulong)uVar46;
                    cVar56 = '\x01';
                    if (uVar18 == 0) {
                      cVar56 = '\x18';
                    }
                  }
                  else {
                    uVar19 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    uVar18 = 0;
                    if (uVar19 != uVar42) {
                      uStack_d8 = 0x1230f2;
                      RAAssignment::reassign
                                ((RAAssignment *)pRStack_a8,(RegGroup)pRStack_b8,uVar46,uVar19,
                                 uVar42);
                      pRVar38 = *(RALocalAllocator **)&pRStack_c0->_pass;
                      uStack_d8 = 0x123108;
                      uVar18 = (**(code **)(*(long *)&pRVar38->_pass + 0x48))
                                         (pRVar38,unaff_R12,uVar19,uVar42);
                    }
                    cVar56 = '\x01';
                    uVar46 = uStack_c4;
                    if (uVar18 != 0) {
                      uVar46 = uVar18;
                    }
                    uVar40 = (ulong)uVar46;
                    if (uVar18 == 0) {
                      puVar35 = (uint *)((long)((Array<unsigned_int_*,_4UL> *)
                                               &pRStack_c0->_clobberedRegs)->_data +
                                        (long)pRStack_b8 * 4);
                      *puVar35 = *puVar35 | 1 << ((byte)uVar19 & 0x1f);
                      cVar56 = '\x18';
                    }
                  }
                }
                pRVar37 = (RALocalAllocator *)0xffffffff;
              }
              else {
                uStack_d8 = 0x123172;
                RAAssignment::swap((RAAssignment *)pRStack_a8,RVar15,uVar46,uVar42,uVar17,
                                   (uint)bVar54);
                pRVar38 = *(RALocalAllocator **)&pRStack_c0->_pass;
                uStack_d8 = 0x12318a;
                uVar46 = (**(code **)(*(long *)&pRVar38->_pass + 0x50))
                                   (pRVar38,unaff_R12,uVar42,unaff_RBP,bVar54);
                cVar56 = uVar46 != 0;
                uVar18 = uStack_c4;
                if ((bool)cVar56) {
                  uVar18 = uVar46;
                }
                uVar40 = (ulong)uVar18;
                pRVar37 = (RALocalAllocator *)0xffffffff;
              }
            }
            uVar18 = (uint)pRVar37;
            unaff_R14 = (RALocalAllocator *)(ulong)uStack_ac;
            pRVar24 = pRStack_b8;
            pRVar29 = pRStack_c0;
            if (cVar56 == '\0') goto LAB_00123322;
            pRVar26 = unaff_R14;
            if (cVar56 == '\x18') goto LAB_0012324b;
          }
        }
LAB_001233f7:
        if ((cVar56 != '\f') && (cVar56 != '\0')) goto LAB_00123412;
        uVar16 = uVar16 - 1 & uVar16;
        unaff_R15 = (RALocalAllocator *)(ulong)uVar16;
      } while (uVar16 != 0);
      cVar56 = '\0';
LAB_00123412:
      uVar30 = uStack_98;
    } while (cVar56 == '\0');
    unaff_R15 = (RALocalAllocator *)CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
  }
  goto LAB_00123569;
  while( true ) {
    uVar16 = 0;
    if (uVar42 != 0) {
      for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
    }
    unaff_RBP = (ulong)uVar16;
    uVar42 = 1 << ((byte)uVar16 & 0x1f);
    unaff_R12 = (RALocalAllocator *)(ulong)uVar42;
    if (((((pRVar26->_curAssignment)._physToWorkMap)->assigned)._masks._data[(long)pRVar24] >>
         (uVar16 & 0x1f) & 1) == 0) {
      uVar18 = *(uint *)((&uStack_58)[(long)pRVar24] + unaff_RBP * 4);
      unaff_R14 = (RALocalAllocator *)(ulong)uVar18;
      if (*(uint *)(plStack_90 + 1) <= uVar18) goto LAB_001235f1;
      if ((*(ulong *)(*plStack_90 + (ulong)(uVar18 >> 6) * 8) >> ((ulong)unaff_R14 & 0x3f) & 1) == 0
         ) goto LAB_001235f6;
      uStack_c4 = CONCAT31(uStack_c4._1_3_,bVar55);
      unaff_R13 = 0;
      uVar50 = uVar40 & 0xffffffff;
      uStack_d8 = 0x1234cb;
      uStack_98 = uVar30;
      RAAssignment::assign((RAAssignment *)pRStack_a8,(RegGroup)uStack_ac,uVar18,uVar16,false);
      pRVar38 = *(RALocalAllocator **)&pRVar26->_pass;
      pRVar37 = (RALocalAllocator *)(ulong)uVar18;
      uStack_d8 = 0x1234d9;
      uVar16 = (**(code **)(*(long *)&pRVar38->_pass + 0x58))(pRVar38,pRVar37,uVar16);
      uVar40 = uVar50;
      if (uVar16 != 0) {
        uVar40 = (ulong)uVar16;
      }
      uVar53 = (undefined7)(uVar50 >> 8);
      uVar30 = uStack_98;
      this = pRVar26;
      pRVar24 = pRStack_b8;
      pRVar29 = pRStack_c0;
      if (uVar16 == 0) {
        unaff_R15 = (RALocalAllocator *)CONCAT71(uVar53,(undefined1)uStack_c4);
        if ((*(uint *)((long)(&pRStack_60->_availableRegs + -1) + (long)pRStack_b8 * 4 + 8) & uVar42
            ) != 0) {
          puVar35 = (((pRStack_c0->_curAssignment)._physToWorkMap)->dirty)._masks._data +
                    (long)pRStack_b8;
          *puVar35 = *puVar35 | uVar42;
        }
        unaff_R13 = 1;
        if (((*(uint *)((long)(&pRStack_60->_availableRegs + -1) + (long)pRStack_b8 * 4 + 8) &
             uVar42) != 0) !=
            (((((pRStack_c0->_curAssignment)._physToWorkMap)->dirty)._masks._data[(long)pRStack_b8]
             & uVar42) != 0)) goto LAB_001235fb;
      }
      else {
        unaff_R15 = (RALocalAllocator *)CONCAT71(uVar53,(undefined1)uStack_c4);
      }
    }
    else {
      unaff_R13 = CONCAT71((int7)(unaff_R13 >> 8),1);
      if ((byte)uStack_9c == '\0') goto LAB_001235ec;
    }
    uVar30 = (ulong)((uint)uVar30 - 1 & (uint)uVar30);
    pRVar26 = pRVar29;
    if ((char)unaff_R13 == '\0') break;
LAB_00123437:
    uVar42 = (uint)uVar30;
    bVar55 = uVar42 != 0;
    unaff_R15 = (RALocalAllocator *)CONCAT71((int7)((ulong)unaff_R15 >> 8),bVar55);
    pRVar29 = pRVar26;
    if (uVar42 == 0) break;
  }
LAB_00123569:
  EVar20 = (Error)uVar40;
  if ((byte)unaff_R15 != 0) goto LAB_0012357e;
  pRVar24 = (RALocalAllocator *)
            ((long)&(((Layout *)&pRVar24->_pass)->physIndex).super_RARegCount.field_0._packed + 1);
  if (pRVar24 == (RALocalAllocator *)0x4) goto code_r0x0012357b;
  goto LAB_00122eb5;
code_r0x0012357b:
  EVar20 = 0;
LAB_0012357e:
  bVar54 = (byte)unaff_R15 | (byte)uStack_9c;
  unaff_R15 = (RALocalAllocator *)CONCAT71((int7)((ulong)unaff_R15 >> 8),bVar54);
  if (bVar54 != 0) {
    return EVar20;
  }
  pRVar41 = (RALocalAllocator *)auStack_80;
  uStack_d8 = 0x123594;
  pRVar29 = pRStack_a8;
  bVar55 = RAAssignment::equals((RAAssignment *)pRVar41,(RAAssignment *)pRStack_a8);
  uVar42 = (uint)pRVar29;
  if (bVar55) {
    return 0;
  }
LAB_00123614:
  uStack_d8 = 0x123619;
  switchToAssignment();
  uStack_d8 = unaff_RBP;
  pRStack_e0 = unaff_R15;
  pRStack_e8 = unaff_R14;
  uStack_f0 = unaff_R13;
  pRStack_f8 = unaff_R12;
  pRStack_100 = this;
  pRStack_108 = (RALocalAllocator *)&pRVar41->_curAssignment;
  pRVar29 = pRVar41;
  while( true ) {
    if (uVar42 == 0) {
      this = (RALocalAllocator *)0x0;
      goto LAB_001236e8;
    }
    uVar16 = 0;
    if (uVar42 != 0) {
      for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
    }
    uVar18 = 1 << ((byte)uVar16 & 0x1f);
    if (((((pRVar41->_curAssignment)._physToWorkMap)->assigned)._masks._data[0] >> (uVar16 & 0x1f) &
        1) != 0) break;
    bVar55 = true;
LAB_001236d1:
    uVar42 = uVar42 - 1 & uVar42;
    if (!bVar55) {
LAB_001236e8:
      return (Error)this;
    }
  }
  pPVar33 = (pRVar41->_curAssignment)._physToWorkMap;
  pRVar26 = (RALocalAllocator *)(ulong)uVar16;
  uVar17 = (pRVar41->_curAssignment)._physToWorkIds._data[0][(long)pRVar26];
  uVar40 = (ulong)uVar17;
  uVar45 = (pPVar33->dirty)._masks._data[0];
  if ((uVar45 & uVar18) == 0) {
LAB_001236b0:
    unaff_R15 = (RALocalAllocator *)0x0;
    uStack_110 = 0x1236c3;
    pRVar29 = pRStack_108;
    RAAssignment::unassign((RAAssignment *)pRStack_108,k0,uVar17,uVar16);
LAB_001236c3:
    bVar55 = (int)unaff_R15 == 0;
    this = (RALocalAllocator *)((ulong)this & 0xffffffff);
    if (!bVar55) {
      this = unaff_R15;
    }
    goto LAB_001236d1;
  }
  if (uVar17 == 0xffffffff) {
    uStack_110 = 0x1236fe;
    spillScratchGpRegsBeforeEntry();
LAB_001236fe:
    uStack_110 = 0x123703;
    spillScratchGpRegsBeforeEntry();
LAB_00123703:
    uStack_110 = 0x123708;
    spillScratchGpRegsBeforeEntry();
  }
  else {
    if ((pRVar41->_curAssignment)._layout.workCount <= uVar17) goto LAB_001236fe;
    bVar54 = (pRVar41->_curAssignment)._workToPhysMap[uVar40].physIds[0];
    pRVar29 = (RALocalAllocator *)(ulong)bVar54;
    if (uVar16 != bVar54) goto LAB_00123703;
    pRVar29 = (RALocalAllocator *)(pRVar41->_curAssignment)._physToWorkIds._data[0];
    if (*(uint *)((long)(pRVar29->_availableRegs)._masks._data +
                 (long)((long)&pRVar26[-1]._tmpWorkToPhysMap + 2) * 4) == uVar17) {
      (pPVar33->dirty)._masks._data[0] = uVar45 & ~uVar18;
      pRVar29 = *(RALocalAllocator **)&pRVar41->_pass;
      uStack_110 = 0x1236a9;
      uVar18 = (**(code **)(*(long *)&pRVar29->_pass + 0x60))(pRVar29,uVar40,uVar16);
      unaff_R15 = (RALocalAllocator *)(ulong)uVar18;
      if (uVar18 == 0) goto LAB_001236b0;
      goto LAB_001236c3;
    }
  }
  uStack_110 = 0x12370d;
  spillScratchGpRegsBeforeEntry();
  uStack_110 = (ulong)uVar16;
  pRStack_118 = unaff_R15;
  pRStack_120 = pRVar41;
  uStack_128 = uVar40;
  uStack_130 = (ulong)uVar42;
  pRStack_138 = this;
  pRStack_350 = pRVar26;
  pRStack_388 = *(RALocalAllocator **)((long)(pRVar26->_availableRegs)._masks._data + 8);
  (pRVar29->_cc->super_BaseBuilder)._cursor = (BaseNode *)*(PhysToWorkMap **)&pRVar26->_pass;
  pRVar29->_node = (InstNode *)pRVar26;
  pRVar29->_raInst = (RAInst *)pRStack_388;
  pRVar29->_tiedTotal = (((RARegMask *)&pRStack_388->_archTraits)->_masks)._data[0];
  (pRVar29->_tiedCount).field_0 =
       (anon_union_4_2_ebeb14a8_for_RARegCount_0)(pRStack_388->_availableRegs)._masks._data[0];
  pRStack_3d0 = (RALocalAllocator *)&pRVar29->_curAssignment;
  ppuStack_348 = (uint **)((pRVar26->_funcPreservedRegs)._masks._data + 2);
  pRStack_408 = (RALocalAllocator *)0x0;
  uStack_390 = 0;
  pRStack_400 = pRVar29;
LAB_0012378e:
  pRVar34 = (RALocalAllocator *)0x0;
  bVar54 = (char)pRStack_408 * '\b';
  uStack_3e8 = (RALocalAllocator *)pRVar29->_raInst;
  pRVar26 = (RALocalAllocator *)0xff;
  uVar42 = (((RARegMask *)&uStack_3e8->_archTraits)->_masks)._data[1] >> (bVar54 & 0x1f) & 0xff;
  pRStack_3e0 = (RALocalAllocator *)(ulong)uVar42;
  pRVar44 = (RALocalAllocator *)
            ((long)(uStack_3e8->_curAssignment)._physToWorkIds._data + ((ulong)(uVar42 << 5) - 0x24)
            );
  uStack_3ec = (uStack_3e8->_clobberedRegs)._masks._data
               [(long)((long)&(((Layout *)&pRStack_408->_pass)->physIndex).super_RARegCount.field_0.
                              _packed + 1)];
  uStack_3bc = (uStack_3e8->_funcPreservedRegs)._masks._data
               [(long)((long)&(((Layout *)&pRStack_408->_pass)->physIndex).super_RARegCount.field_0.
                              _packed + 1)];
  uStack_39c = (pRVar29->_tiedCount).field_0._packed >> (bVar54 & 0x1f) & 0xff;
  pRVar38 = (RALocalAllocator *)(ulong)uStack_39c;
  pRStack_3f8 = pRVar44;
  pRVar37 = pRStack_408;
  pRVar41 = pRVar44;
  if (uStack_39c != 0) {
    pRVar39 = (RALocalAllocator *)(ulong)uStack_39c;
    pRVar43 = (RALocalAllocator *)0x0;
    pRVar28 = (RALocalAllocator *)(ulong)uStack_39c;
    uStack_3a8 = (RALocalAllocator *)((ulong)uStack_3a8._4_4_ << 0x20);
    uVar16 = 0;
    pRVar48 = (RALocalAllocator *)0x0;
    do {
      uVar18 = *(uint *)&pRVar41->_cc;
      pRVar47 = pRVar48;
      if ((uVar18 & 0x1c00) == 0) {
        pRVar24 = (RALocalAllocator *)(ulong)uVar16;
LAB_00123857:
        if ((uVar18 & 0x40008) != 0) {
          pRVar47 = (RALocalAllocator *)(ulong)((int)pRVar48 + 1);
          auStack_340[(long)pRVar48] = pRVar41;
        }
        if ((uVar18 >> 0x10 & 1) != 0) {
          uVar40 = (ulong)uStack_3a8 & 0xffffffff;
          pRVar26 = (RALocalAllocator *)(ulong)((int)uStack_3a8 + 1U);
          uStack_3a8 = (RALocalAllocator *)CONCAT44(uStack_3a8._4_4_,(int)uStack_3a8 + 1U);
          auStack_240[uVar40] = pRVar41;
        }
        iVar36 = (int)pRVar28;
        uVar16 = (uint)pRVar24;
        if ((uVar18 & 4) == 0) {
          *(uint *)&pRVar41->_cc = uVar18 | 0x100;
          pRVar28 = (RALocalAllocator *)(ulong)(iVar36 - 1);
          pRVar38 = (RALocalAllocator *)0x6;
          goto LAB_001239a2;
        }
        pRVar38 = (RALocalAllocator *)0x6;
        if ((uVar18 >> 10 & 1) != 0) goto LAB_001239a2;
        uVar17 = (((Layout *)&pRVar41->_pass)->physIndex).super_RARegCount.field_0._packed;
        pRVar26 = (RALocalAllocator *)0xffffffff;
        if ((ulong)uVar17 == 0xffffffff) goto LAB_00124d60;
        if ((pRVar29->_curAssignment)._layout.workCount <= uVar17) goto LAB_00124d65;
        bVar54 = (pRVar29->_curAssignment)._workToPhysMap[uVar17].physIds[0];
        bVar5 = *(byte *)((long)&pRVar41->_cc + 6);
        pRVar26 = (RALocalAllocator *)(ulong)bVar5;
        if (bVar5 == 0xff) {
          pRVar38 = (RALocalAllocator *)0x0;
          if (bVar54 != 0xff) {
            uVar45 = 1 << (bVar54 & 0x1f);
            uVar17 = ~uStack_3ec & *(uint *)&pRVar41->_archTraits;
            pRVar26 = (RALocalAllocator *)(ulong)uVar17;
            if ((uVar17 >> (bVar54 & 0x1f) & 1) == 0) {
              pRVar43 = (RALocalAllocator *)(ulong)((uint)pRVar43 | uVar45);
            }
            else {
              *(byte *)((long)&pRVar41->_cc + 6) = bVar54;
              *(uint *)&pRVar41->_cc = uVar18 | 0x100;
              if ((uVar18 & 2) != 0) {
                puVar35 = (((pRVar29->_curAssignment)._physToWorkMap)->dirty)._masks._data +
                          (long)pRStack_408;
                *puVar35 = *puVar35 | uVar45;
              }
              pRVar28 = (RALocalAllocator *)(ulong)(iVar36 - 1);
              uStack_3ec = uStack_3ec | uVar45;
            }
            pRVar38 = (RALocalAllocator *)0x0;
            pRVar37 = pRStack_408;
          }
          goto LAB_001239a2;
        }
        uVar17 = 1 << (bVar5 & 0x1f);
        pRVar38 = (RALocalAllocator *)(ulong)uStack_3ec;
        pRVar48 = pRVar47;
        if ((uStack_3ec >> (bVar5 & 0x1f) & 1) != 0) {
          if (bVar54 == bVar5) {
            *(uint *)&pRVar41->_cc = uVar18 | 0x100;
            pRVar26 = (RALocalAllocator *)(ulong)(uVar18 | 0x100);
            if ((uVar18 & 2) != 0) {
              puVar35 = (((pRVar29->_curAssignment)._physToWorkMap)->dirty)._masks._data +
                        (long)pRStack_408;
              *puVar35 = *puVar35 | 1 << (bVar54 & 0x1f);
              pRVar26 = pRStack_408;
              pRVar37 = pRStack_408;
            }
            pRVar28 = (RALocalAllocator *)(ulong)(iVar36 - 1);
            uStack_3ec = uStack_3ec | uVar17;
          }
          else {
            pRVar43 = (RALocalAllocator *)
                      (ulong)((uint)pRVar43 |
                             uVar17 & (((pRVar29->_curAssignment)._physToWorkMap)->assigned)._masks.
                                      _data[(long)pRVar37]);
          }
          pRVar38 = (RALocalAllocator *)0x0;
          goto LAB_001239a2;
        }
        goto LAB_00124d8d;
      }
      pRVar26 = (RALocalAllocator *)(ulong)(uVar18 >> 0xd & 3);
      if ((uVar18 >> 0xc & 1) != 0) {
        pRVar26 = pRVar34;
      }
      uVar17 = 1 << (sbyte)pRVar26;
      if ((uVar16 >> (int)pRVar26 & 1) == 0) {
        *(RALocalAllocator **)(auStack_380 + (long)pRVar26 * 8 + 0x10) = pRVar41;
        uVar45 = uVar17 | uVar16;
      }
      else {
        uStack_40c = 3;
        uVar45 = uVar16;
      }
      pRVar24 = (RALocalAllocator *)(ulong)uVar45;
      if ((uVar17 & uVar16) == 0) goto LAB_00123857;
      pRVar38 = (RALocalAllocator *)0x1;
      uVar16 = uVar45;
LAB_001239a2:
      if (((int)pRVar38 != 6) && ((int)pRVar38 != 0)) goto LAB_00124d0e;
      pRVar41 = (RALocalAllocator *)((long)(pRVar41->_availableRegs)._masks._data + 8);
      pRVar39 = (RALocalAllocator *)((long)&pRVar39[-1]._tmpWorkToPhysMap + 7);
      pRVar48 = pRVar47;
      if (pRVar39 == (RALocalAllocator *)0x0) goto LAB_001239ef;
    } while( true );
  }
  uVar16 = 0;
  uStack_3a8 = (RALocalAllocator *)((ulong)uStack_3a8._4_4_ << 0x20);
  pRVar28 = (RALocalAllocator *)0x0;
  pRVar43 = (RALocalAllocator *)0x0;
  pRVar39 = uStack_3e8;
  pRVar48 = (RALocalAllocator *)0x0;
LAB_001239ef:
  uVar14 = auStack_380._16_8_;
  pRStack_3c8 = (RALocalAllocator *)((ulong)pRStack_3c8 & 0xffffffff00000000);
  uStack_3d4 = (uint)pRVar48;
  if (uVar16 != 0) {
    pRVar38 = (RALocalAllocator *)0x1;
    if ((uVar16 + 1 & uVar16) != 0) {
      uStack_40c = 3;
      goto LAB_00124d0e;
    }
    uVar18 = 0;
    if (~uVar16 != 0) {
      for (; (~uVar16 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
      }
    }
    pRStack_398 = (RALocalAllocator *)(ulong)uVar18;
    pRVar39 = (RALocalAllocator *)CONCAT71((int7)((ulong)pRVar39 >> 8),1);
    pRVar26 = pRStack_398;
    if ((*(uint32_t *)(auStack_380._16_8_ + 8) & 0x400) == 0) goto LAB_00123c96;
    uVar16 = *(uint *)((long)(pRVar29->_availableRegs)._masks._data + (long)pRVar37 * 4) |
             (uint)pRVar43;
    pRVar39 = (RALocalAllocator *)(ulong)uVar16;
    pRVar41 = (RALocalAllocator *)(ulong)uVar18;
    if (uVar18 != 0) {
      uVar17 = (pRVar29->_curAssignment)._layout.workCount;
      pRVar26 = (RALocalAllocator *)(ulong)uVar17;
      pRVar24 = (RALocalAllocator *)(pRVar29->_curAssignment)._workToPhysMap;
      lVar21 = 0;
      while( true ) {
        uVar45 = **(uint **)(auStack_380 + lVar21 * 8 + 0x10);
        pRVar47 = pRVar48;
        if ((ulong)uVar45 == 0xffffffff) goto LAB_00124d6a;
        pRVar27 = pRVar26;
        pRVar32 = pRVar28;
        if (uVar17 <= uVar45) break;
        *(uint *)(auStack_380 + lVar21 * 4) =
             (uint)*(byte *)((long)(pRVar24->_availableRegs)._masks._data + ((ulong)uVar45 - 0x18));
        lVar21 = lVar21 + 1;
        if (pRVar41 == (RALocalAllocator *)lVar21) goto LAB_00123aa3;
      }
      goto LAB_00124d6f;
    }
LAB_00123aa3:
    uStack_3d8 = (uint)pRVar28;
    uVar17 = *(uint *)((Array<asmjit::v1_14::InstHints,_4UL> *)(uVar14 + 0x10))->_data;
    if (uVar17 == 0) {
      pRVar22 = (RALocalAllocator *)0xffffffff;
    }
    else {
      uVar16 = uVar16 & ~uStack_3ec;
      pRVar39 = (RALocalAllocator *)(ulong)uVar16;
      pLVar12 = (Layout *)&pRVar29->_pass;
      pRVar22 = (RALocalAllocator *)0xffffffff;
      pRVar37 = (RALocalAllocator *)0x0;
      pRStack_3b8 = (RALocalAllocator *)CONCAT44(pRStack_3b8._4_4_,uVar17);
      uVar45 = uVar17;
      do {
        pRVar32 = (RALocalAllocator *)(ulong)uVar45;
        uVar46 = 0;
        if (uVar45 != 0) {
          for (; (uVar45 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
          }
        }
        pRVar34 = (RALocalAllocator *)(ulong)uVar46;
        if ((uVar17 >> (uVar46 & 0x1f) & 1) != 0) {
          if (uVar18 == 0) {
            pRVar47 = (RALocalAllocator *)0xf;
          }
          else {
            pRVar27 = (RALocalAllocator *)(ulong)uVar46;
            pRVar47 = (RALocalAllocator *)0xf;
            pRVar29 = (RALocalAllocator *)0x0;
            pRVar51 = (RALocalAllocator *)0x1;
            do {
              uVar46 = 1 << ((byte)pRVar27 & 0x1f) & uVar16;
              pRVar26 = (RALocalAllocator *)(ulong)uVar46;
              if (uVar46 == 0) {
                pRVar47 = (RALocalAllocator *)0x0;
              }
              else {
                if ((*(PhysToWorkMap **)pLVar12)[9].assigned._masks._data[1] <=
                    **(uint **)(auStack_380 + (long)pRVar29 * 2 + 0x10)) {
                  pcStack_418 = (code *)0x124d47;
                  allocInst();
                  goto LAB_00124d47;
                }
                pRVar38 = (RALocalAllocator *)
                          (ulong)(pRVar27 ==
                                 (RALocalAllocator *)(ulong)*(uint *)(auStack_380 + (long)pRVar29));
                pRVar47 = (RALocalAllocator *)
                          (ulong)((int)pRVar47 +
                                  (uint)(pRVar27 ==
                                        (RALocalAllocator *)
                                        (ulong)*(byte *)(*(long *)(*(long *)(*(PhysToWorkMap **)
                                                                              pLVar12)[8].workIds +
                                                                  (ulong)**(uint **)(auStack_380 +
                                                                                    (long)pRVar29 *
                                                                                    2 + 0x10) * 8) +
                                                        0x4a)) +
                                 (uint)(pRVar27 ==
                                       (RALocalAllocator *)
                                       (ulong)*(uint *)(auStack_380 + (long)pRVar29)) * 2);
              }
              unaff_R15 = pRVar51;
              if (uVar46 == 0) break;
              pRVar29 = (RALocalAllocator *)&((Layout *)&pRVar29->_pass)->physCount;
              pRVar27 = (RALocalAllocator *)
                        ((long)&(((Layout *)&pRVar27->_pass)->physIndex).super_RARegCount.field_0.
                                _packed + 1);
              unaff_R15 = (RALocalAllocator *)
                          ((long)&(((Layout *)&pRVar51->_pass)->physIndex).super_RARegCount.field_0
                          + 1);
              bVar55 = pRVar51 < pRVar41;
              pRVar51 = unaff_R15;
            } while (bVar55);
          }
          pRVar24 = pRVar43;
          pRVar29 = pRStack_400;
          if ((uint)pRVar37 < (uint)pRVar47) {
            pRVar22 = pRVar34;
            pRVar37 = pRVar47;
          }
        }
        uVar45 = uVar45 - 1 & uVar45;
        pRVar26 = (RALocalAllocator *)(ulong)uVar45;
      } while (uVar45 != 0);
    }
    bVar55 = (int)pRVar22 == -1;
    pRVar39 = (RALocalAllocator *)CONCAT71((int7)((ulong)pRVar39 >> 8),!bVar55);
    if (bVar55) {
      uStack_40c = 0x3d;
      pRVar37 = pRStack_408;
LAB_00123c96:
      pRVar38 = (RALocalAllocator *)0x1;
      if ((char)pRVar39 == '\0') goto LAB_00124d0e;
      goto LAB_00123c9f;
    }
    pRVar34 = (RALocalAllocator *)0x0;
    pRVar26 = pRStack_398;
    pRVar37 = pRStack_408;
    if (uVar18 == 0) goto LAB_00123c96;
    pRVar41 = (RALocalAllocator *)(ulong)(uVar18 * 8);
    pRVar24 = (RALocalAllocator *)0x0;
    while( true ) {
      pRVar38 = (RALocalAllocator *)0x1;
      uVar16 = 1 << ((byte)pRVar22 & 0x1f);
      puVar35 = *(uint **)((long)((long)(&pRVar24->_availableRegs + -1) + 8) + (long)auStack_380);
      pRVar26 = (RALocalAllocator *)(ulong)*puVar35;
      if (pRVar26 == (RALocalAllocator *)0xffffffff) goto LAB_00124d92;
      if ((pRVar29->_curAssignment)._layout.workCount <= *puVar35) break;
      bVar54 = (pRVar29->_curAssignment)._workToPhysMap[(long)pRVar26].physIds[0];
      pRVar26 = (RALocalAllocator *)(ulong)bVar54;
      *(byte *)((long)puVar35 + 0xe) = (byte)pRVar22;
      if ((uint)pRVar22 == (uint)bVar54) {
        uVar18 = puVar35[2];
        puVar35[2] = uVar18 | 0x100;
        if ((uVar18 & 2) != 0) {
          pRVar26 = (RALocalAllocator *)(pRVar29->_curAssignment)._physToWorkMap;
          puVar35 = (uint *)((long)(&pRVar26->_availableRegs + -1) + (long)pRStack_408 * 4 + 8);
          *puVar35 = *puVar35 | 1 << (bVar54 & 0x1f);
        }
        pRVar28 = (RALocalAllocator *)(ulong)((int)pRVar28 - 1);
      }
      else {
        uVar18 = (((pRVar29->_curAssignment)._physToWorkMap)->assigned)._masks._data
                 [(long)pRStack_408] & uVar16;
        pRVar26 = (RALocalAllocator *)(ulong)uVar18;
        pRVar43 = (RALocalAllocator *)(ulong)((uint)pRVar43 | uVar18);
      }
      uStack_3ec = uStack_3ec | uVar16;
      pRVar24 = (RALocalAllocator *)&pRVar24->_cc;
      pRVar22 = (RALocalAllocator *)(ulong)((uint)pRVar22 + 1);
      if (pRVar41 == pRVar24) goto LAB_00123c96;
    }
    goto LAB_00124d97;
  }
  pRStack_398 = (RALocalAllocator *)0x0;
LAB_00123c9f:
  pRVar27 = pRVar26;
  pRVar32 = pRVar28;
  pRVar26 = pRVar43;
  if ((uint)pRVar28 != 0) {
    pRVar38 = (RALocalAllocator *)0x0;
    pRVar26 = (RALocalAllocator *)(ulong)uStack_39c;
    if (uStack_39c == 0) {
LAB_001240f6:
      pRStack_3c8 = (RALocalAllocator *)CONCAT44(pRStack_3c8._4_4_,(int)pRVar28);
      pRVar27 = pRVar26;
      pRVar32 = pRVar28;
      pRVar26 = pRVar43;
      if ((int)pRVar38 != 0) goto LAB_00124d0e;
      goto LAB_00124102;
    }
    uStack_3d8 = (uint)pRVar28;
    pRVar34 = (RALocalAllocator *)
              (ulong)(~(uint)pRVar43 &
                     (((pRVar29->_curAssignment)._physToWorkMap)->assigned)._masks._data
                     [(long)pRVar37]);
    pRVar39 = (RALocalAllocator *)
              ((long)(uStack_3e8->_curAssignment)._physToWorkIds._data +
              ((ulong)(uVar42 << 5) - 0xc));
    pRVar24 = (RALocalAllocator *)(ulong)(uStack_39c << 5);
    pRVar32 = (RALocalAllocator *)0x0;
    pRStack_3c8 = pRVar39;
    pRStack_3b8 = pRVar24;
    while( true ) {
      pRVar38 = (RALocalAllocator *)0x0;
      uVar42 = *(uint *)((long)&pRVar39[-1]._tiedTotal + (long)pRVar32);
      pRVar48 = (RALocalAllocator *)0x16;
      if ((uVar42 >> 8 & 1) != 0) goto LAB_00124087;
      uVar16 = *(uint *)((long)&pRVar39[-1]._raInst + (long)pRVar32);
      unaff_R15 = (RALocalAllocator *)(ulong)uVar16;
      pRVar27 = (RALocalAllocator *)0xffffffff;
      if (unaff_R15 == (RALocalAllocator *)0xffffffff) goto LAB_00124d74;
      if ((pRVar29->_curAssignment)._layout.workCount <= uVar16) goto LAB_00124d79;
      pRVar26 = (RALocalAllocator *)(pRVar29->_curAssignment)._workToPhysMap;
      bVar54 = *(byte *)((long)(pRVar26->_availableRegs)._masks._data + (long)&unaff_R15[-1]._raInst
                        );
      uVar18 = (uint)bVar54;
      pRVar28 = pRVar29;
      if ((((uStack_390 & 1) == 0) && ((uVar42 & 0x10) != 0)) && (bVar54 == 0xff)) break;
LAB_00123d37:
      uVar42 = uStack_3ec;
      pRVar48 = (RALocalAllocator *)0x0;
      pRVar29 = pRVar28;
      if ((pRVar39[-1]._tiedCount.field_0._regs + 2)[(long)pRVar32] == 0xff) {
        pRStack_3e0 = (RALocalAllocator *)CONCAT44(pRStack_3e0._4_4_,(int)pRVar34);
        uStack_3b0 = (uint32_t *)(CONCAT44(uStack_3b0._4_4_,(int)pRVar37) & 0xffffffff000000ff);
        uStack_3e8 = (RALocalAllocator *)CONCAT44(uStack_3e8._4_4_,uVar18);
        pcStack_418 = (code *)0x123d76;
        uVar19 = decideOnAssignment(pRVar28,(RegGroup)pRVar37,uVar16,(uint32_t)pRVar26,
                                    ~(uStack_3ec | (uint)pRVar43) &
                                    *(uint *)((long)&pRVar39[-1]._tmpWorkToPhysMap + (long)pRVar32))
        ;
        pRVar41 = (RALocalAllocator *)((ulong)uStack_3e8 & 0xffffffff);
        pRVar26 = (RALocalAllocator *)(ulong)uVar19;
        uVar18 = 1 << ((byte)uVar19 & 0x1f);
        uStack_3ec = uVar42 | 1 << (uVar19 & 0x1f);
        uVar42 = (uint)pRStack_3e0;
        pRVar34 = (RALocalAllocator *)((ulong)pRStack_3e0 & 0xffffffff);
        uVar17 = (uint)pRVar43 | uVar18 & (uint)pRStack_3e0;
        pRVar43 = (RALocalAllocator *)(ulong)uVar17;
        (pRStack_3c8[-1]._tiedCount.field_0._regs + 2)[(long)pRVar32] = (byte)uVar19;
        if ((uint)uStack_3e8 == 0xff) {
          if ((uVar18 & (uint)pRStack_3e0) == 0) {
            pRVar41 = (RALocalAllocator *)0x0;
            pcStack_418 = (code *)0x124005;
            uStack_3c0 = uVar18;
            RAAssignment::assign
                      ((RAAssignment *)pRStack_3d0,(RegGroup)uStack_3b0,uVar16,uVar19,false);
            pcStack_418 = (code *)0x124019;
            uVar16 = (**(code **)(*(long *)((*(PhysToWorkMap **)&pRStack_400->_pass)->assigned).
                                           _masks._data + 0x58))
                               (*(PhysToWorkMap **)&pRStack_400->_pass,unaff_R15,uVar19);
            if (uVar16 != 0) {
              uStack_40c = uVar16;
            }
            pRVar26 = (RALocalAllocator *)(ulong)uStack_40c;
            if (uVar16 != 0) {
              pRVar48 = (RALocalAllocator *)0x1;
              pRVar37 = pRStack_408;
              pRVar39 = pRStack_3c8;
              pRVar24 = pRStack_3b8;
              pRVar44 = pRStack_3f8;
              pRVar29 = pRStack_400;
              goto LAB_00124087;
            }
            uVar16 = *(uint *)((long)&pRStack_3c8[-1]._tiedTotal + (long)pRVar32);
            uVar18 = uVar16 | 0x100;
            pRVar26 = (RALocalAllocator *)(ulong)uVar18;
            *(uint *)((long)&pRStack_3c8[-1]._tiedTotal + (long)pRVar32) = uVar18;
            if ((uVar16 & 2) != 0) {
              puVar35 = (((pRStack_400->_curAssignment)._physToWorkMap)->dirty)._masks._data +
                        (long)pRStack_408;
              *puVar35 = *puVar35 | uStack_3c0;
            }
            uStack_3d8 = uStack_3d8 - 1;
            uVar18 = uStack_3c0;
          }
        }
        else {
          uVar42 = (uint)pRStack_3e0 & ~(1 << ((uint)uStack_3e8 & 0x1f));
          pRVar34 = (RALocalAllocator *)(ulong)uVar42;
          bVar55 = true;
          if ((uVar18 & uVar42) == 0) {
            uVar45 = 0;
            if (uVar19 != (uint)uStack_3e8) {
              pcStack_418 = (code *)0x123f93;
              uStack_3c0 = uVar18;
              RAAssignment::reassign
                        ((RAAssignment *)pRStack_3d0,(RegGroup)uStack_3b0,uVar16,uVar19,
                         (uint)uStack_3e8);
              pcStack_418 = (code *)0x123fab;
              uVar45 = (**(code **)(*(long *)((*(PhysToWorkMap **)&pRStack_400->_pass)->assigned).
                                             _masks._data + 0x48))
                                 (*(PhysToWorkMap **)&pRStack_400->_pass,unaff_R15,uVar19,
                                  (ulong)uStack_3e8 & 0xffffffff);
              pRVar41 = (RALocalAllocator *)((ulong)uStack_3e8 & 0xffffffff);
              uVar18 = uStack_3c0;
            }
            if (uVar45 != 0) {
              uStack_40c = uVar45;
            }
            pRVar26 = (RALocalAllocator *)(ulong)uStack_40c;
            if (uVar45 == 0) {
              uVar16 = *(uint *)((long)&pRStack_3c8[-1]._tiedTotal + (long)pRVar32);
              uVar45 = uVar16 | 0x100;
              pRVar26 = (RALocalAllocator *)(ulong)uVar45;
              *(uint *)((long)&pRStack_3c8[-1]._tiedTotal + (long)pRVar32) = uVar45;
              if ((uVar16 & 2) != 0) {
                puVar35 = (((pRStack_400->_curAssignment)._physToWorkMap)->dirty)._masks._data +
                          (long)pRStack_408;
                *puVar35 = *puVar35 | uVar18;
              }
              uStack_3d8 = uStack_3d8 - 1;
              bVar55 = true;
            }
            else {
              bVar55 = false;
            }
          }
          pRVar43 = (RALocalAllocator *)(ulong)(uVar17 | 1 << ((uint)pRVar41 & 0x1f));
          if (!bVar55) {
            pRVar48 = (RALocalAllocator *)0x1;
            pRVar37 = pRStack_408;
            pRVar39 = pRStack_3c8;
            pRVar24 = pRStack_3b8;
            pRVar44 = pRStack_3f8;
            pRVar29 = pRStack_400;
            goto LAB_00124087;
          }
        }
        pRVar34 = (RALocalAllocator *)(ulong)(uVar42 | uVar18);
        pRVar37 = pRStack_408;
        pRVar39 = pRStack_3c8;
        pRVar24 = pRStack_3b8;
        pRVar44 = pRStack_3f8;
        pRVar29 = pRStack_400;
      }
LAB_00124087:
      if ((((int)pRVar48 != 0x16) && (pRVar38 = pRVar48, (int)pRVar48 != 0)) ||
         (pRVar32 = (RALocalAllocator *)((long)(pRVar32->_availableRegs)._masks._data + 8),
         pRVar38 = (RALocalAllocator *)0x0, pRVar24 == pRVar32)) {
        pRVar28 = (RALocalAllocator *)(ulong)uStack_3d8;
        goto LAB_001240f6;
      }
    }
    uVar42 = *(uint *)((long)&(pRVar39->_availableRegs)._masks + (long)&pRVar32[-1]._raInst);
    pRVar29 = (RALocalAllocator *)(ulong)uVar42;
    uVar17 = uVar42 ^ uVar42 - 1;
    pRVar26 = (RALocalAllocator *)(ulong)uVar17;
    pRVar28 = pRStack_400;
    if (uVar17 <= uVar42 - 1) goto LAB_00123d37;
    pRStack_3e0 = pRVar43;
    pRVar43 = *(RALocalAllocator **)&pRStack_400->_pass;
    if (uVar16 < pRVar43[1]._curAssignment._layout.physIndex.super_RARegCount.field_0._packed) {
      uStack_3b0 = *(uint32_t **)
                    (*(long *)(pRVar43[1]._funcPreservedRegs._masks._data + 2) + (long)unaff_R15 * 8
                    );
      bVar5 = (pRVar39[-1]._tiedCount.field_0._regs + 1)[(long)pRVar32];
      pRVar41 = (RALocalAllocator *)(ulong)bVar5;
      uVar17 = *(uint *)(*(long *)(uStack_3b0 + 2) + 8);
      pRVar48 = (RALocalAllocator *)0x0;
      uVar18 = (uint)bVar54;
      if (bVar5 <= uVar17) {
        uStack_3c0 = uVar17;
        uVar18 = (uint)bVar54;
        if (*(long *)(uStack_3b0 + 6) == 0) {
          uStack_390 = CONCAT44(uStack_390._4_4_,(uint)bVar5);
          uStack_3e8 = (RALocalAllocator *)CONCAT44(uStack_3e8._4_4_,0xff);
          pcStack_418 = (code *)0x123e8f;
          pRVar23 = RAStackAllocator::newSlot
                              ((RAStackAllocator *)&pRVar43[1]._tmpWorkToPhysMap,
                               *(uint32_t *)((long)&pRVar43[1]._block + 4),uVar17,
                               (uint)*(byte *)(*(long *)(uStack_3b0 + 2) + 0xc),1);
          pRVar41 = (RALocalAllocator *)(uStack_390 & 0xffffffff);
          uVar18 = (uint)uStack_3e8;
          *(RAStackSlot **)(uStack_3b0 + 6) = pRVar23;
          *(byte *)((long)uStack_3b0 + 0x25) = *(byte *)((long)uStack_3b0 + 0x25) | 1;
          pRVar39 = pRStack_3c8;
          pRVar44 = pRStack_3f8;
        }
        uVar17 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        piVar1 = (int *)((long)ppuStack_348 + (ulong)(uVar17 & 0xfffffffc) * 4);
        uVar42 = *(uint *)&pRVar43[1]._block;
        piVar1[1] = uStack_3b0[1];
        piVar1[2] = 0;
        piVar1[3] = 0;
        *piVar1 = (uVar42 & 0xf8) + (int)pRVar41 * 0x1000000 + 0x2002;
        *(undefined4 *)((long)&(pRVar39->_availableRegs)._masks + (long)&pRVar32[-1]._raInst) = 0;
        pbVar2 = (undefined1 *)((long)&pRVar39[-1]._tiedTotal + 1) + (long)pRVar32;
        *pbVar2 = *pbVar2 | 1;
        pbVar2 = (byte *)((long)&pRStack_388->_cc + 7);
        *pbVar2 = *pbVar2 | 0x40;
        uStack_3d8 = uStack_3d8 - 1;
        uStack_390 = CONCAT71((int7)((ulong)pRStack_388 >> 8),1);
        pRVar48 = (RALocalAllocator *)0x16;
        pRVar37 = pRStack_408;
        uVar17 = uStack_3c0;
      }
      pRVar26 = (RALocalAllocator *)(ulong)uVar17;
      pRVar29 = pRStack_400;
      pRVar28 = pRStack_400;
      pRVar43 = pRStack_3e0;
      if ((uint)pRVar41 <= uVar17) goto LAB_00124087;
      goto LAB_00123d37;
    }
    goto LAB_00124da1;
  }
LAB_00124102:
  if ((uint)pRVar26 != 0) {
    uStack_3e8 = (RALocalAllocator *)
                 CONCAT44(uStack_3e8._4_4_,
                          ~(uStack_3ec | (uint)pRVar26 |
                           (((pRVar29->_curAssignment)._physToWorkMap)->assigned)._masks._data
                           [(long)pRVar37] | uStack_3bc) &
                          *(uint *)((long)(pRVar29->_availableRegs)._masks._data + (long)pRVar37 * 4
                                   ));
    do {
      pRVar32 = pRVar26;
      uVar42 = 0;
      uVar16 = (uint)pRVar32;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
        }
      }
      unaff_R15 = (RALocalAllocator *)(ulong)uVar42;
      pRVar27 = unaff_R15;
      if (((((pRVar29->_curAssignment)._physToWorkMap)->assigned)._masks._data[(long)pRVar37] >>
           (uVar42 & 0x1f) & 1) == 0) {
        pRVar38 = (RALocalAllocator *)0x0;
        pRVar26 = pRVar32;
      }
      else {
        uVar18 = (pRVar29->_curAssignment)._physToWorkIds._data[(long)pRVar37][(long)unaff_R15];
        pRVar26 = (RALocalAllocator *)(ulong)uVar18;
        pRVar41 = (RALocalAllocator *)((ulong)uStack_3e8 & 0xffffffff);
        if ((uint)uStack_3e8 == 0) {
          uStack_3e8 = (RALocalAllocator *)((ulong)uStack_3e8 & 0xffffffff00000000);
        }
        else {
          pcStack_418 = (code *)0x12417a;
          pRVar24 = pRStack_388;
          uVar19 = decideOnReassignment
                             (pRVar29,(RegGroup)pRVar37,uVar18,uVar42,(uint)uStack_3e8,
                              (RAInst *)pRStack_388);
          pRVar38 = (RALocalAllocator *)0x0;
          if (uVar19 != 0xff) {
            uVar17 = 0;
            if (uVar19 != uVar42) {
              pRVar41 = (RALocalAllocator *)(ulong)uVar42;
              pcStack_418 = (code *)0x1241c7;
              RAAssignment::reassign
                        ((RAAssignment *)pRStack_3d0,(RegGroup)pRVar37,uVar18,uVar19,uVar42);
              pRVar29 = *(RALocalAllocator **)&pRStack_400->_pass;
              pcStack_418 = (code *)0x1241de;
              uVar17 = (**(code **)(*(long *)(((RARegMask *)&pRVar29->_pass)->_masks)._data + 0x48))
                                 (pRVar29,pRVar26,uVar19,uVar42);
            }
            pRVar38 = (RALocalAllocator *)0x1;
            if (uVar17 != 0) {
              uStack_40c = uVar17;
            }
            pRVar27 = (RALocalAllocator *)(ulong)uStack_40c;
            if (uVar17 == 0) {
              uStack_3e8 = (RALocalAllocator *)
                           CONCAT44(uStack_3e8._4_4_,(uint)uStack_3e8 ^ 1 << (uVar19 & 0x1f));
              puVar35 = (uint *)((long)((Array<unsigned_int_*,_4UL> *)&pRStack_400->_clobberedRegs)
                                       ->_data + (long)pRStack_408 * 4);
              *puVar35 = *puVar35 | 1 << ((byte)uVar19 & 0x1f);
              pRVar38 = (RALocalAllocator *)0x1c;
              pRVar27 = pRStack_400;
            }
          }
          pRVar37 = pRStack_408;
          pRVar39 = pRVar29;
          pRVar44 = pRStack_3f8;
          pRVar29 = pRStack_400;
          if (uVar19 != 0xff) goto LAB_00124291;
        }
        if (((((pRVar29->_curAssignment)._physToWorkMap)->dirty)._masks._data[(long)pRVar37] &
            1 << ((byte)uVar42 & 0x1f)) == 0) {
LAB_0012425f:
          pcStack_418 = (code *)0x124272;
          pRVar39 = pRStack_3d0;
          RAAssignment::unassign((RAAssignment *)pRStack_3d0,(RegGroup)pRVar37,uVar18,uVar42);
          uVar17 = 0;
        }
        else {
          pcStack_418 = (code *)0x124256;
          pRVar39 = pRVar29;
          uVar17 = onSaveReg(pRVar29,(RegGroup)pRVar37,uVar18,uVar42);
          pRVar37 = pRStack_408;
          if (uVar17 == 0) goto LAB_0012425f;
        }
        pRVar38 = (RALocalAllocator *)(ulong)(uVar17 != 0);
        if (uVar17 != 0) {
          uStack_40c = uVar17;
        }
        pRVar27 = (RALocalAllocator *)(ulong)uStack_40c;
        pRVar37 = pRStack_408;
        pRVar44 = pRStack_3f8;
      }
LAB_00124291:
      if (((int)pRVar38 != 0x1c) && ((int)pRVar38 != 0)) goto LAB_001242af;
      uVar16 = uVar16 - 1 & uVar16;
      pRVar26 = (RALocalAllocator *)(ulong)uVar16;
    } while (uVar16 != 0);
    pRVar38 = (RALocalAllocator *)0x0;
LAB_001242af:
    if ((int)pRVar38 != 0) goto LAB_00124d0e;
  }
  if ((int)pRStack_3c8 != 0) {
    uStack_3e8 = (RALocalAllocator *)(ulong)uStack_39c;
    pRStack_3b8 = (RALocalAllocator *)((ulong)pRStack_3b8 & 0xffffffff00000000);
    pRVar43 = pRVar24;
    pRVar51 = unaff_R15;
    do {
      if (uStack_39c == 0) {
        pRVar24 = (RALocalAllocator *)((ulong)pRStack_3c8 & 0xffffffff);
        pRStack_3e0 = pRVar24;
      }
      else {
        pRVar47 = (RALocalAllocator *)0x0;
        pRVar24 = (RALocalAllocator *)((ulong)pRStack_3c8 & 0xffffffff);
        pRStack_3e0 = pRVar24;
        do {
          pRVar38 = (RALocalAllocator *)0x25;
          if (((ulong)*(WorkToPhysMap **)
                       (&pRVar44->_availableRegs)[(long)pRVar47 * 2 + -1]._masks._data & 0x100) == 0
             ) {
            pRVar34 = (RALocalAllocator *)
                      ((long)(&pRVar44->_availableRegs)[(long)pRVar47 * 2 + -2]._masks._data + 8);
            uVar42 = (((Layout *)&pRVar34->_pass)->physIndex).super_RARegCount.field_0._packed;
            pRVar32 = (RALocalAllocator *)(ulong)uVar42;
            if (pRVar32 == (RALocalAllocator *)0xffffffff) goto LAB_00124d47;
            if ((pRVar29->_curAssignment)._layout.workCount <= uVar42) goto LAB_00124d4c;
            bVar54 = (pRVar29->_curAssignment)._workToPhysMap[(long)pRVar32].physIds[0];
            pRVar51 = (RALocalAllocator *)(ulong)bVar54;
            bVar5 = *(byte *)((long)((Array<unsigned_int_*,_4UL> *)&pRVar34->_cc)->_data + 6);
            pRVar26 = (RALocalAllocator *)(ulong)bVar5;
            if (bVar5 == bVar54) goto LAB_00124d51;
            pRVar44 = pRVar29;
            pRVar48 = pRVar26;
            if (0x1f < bVar5) goto LAB_00124d56;
            uVar18 = (uint)bVar5;
            uVar16 = (pRVar29->_curAssignment)._physToWorkIds._data[(long)pRVar37][(long)pRVar26];
            pRVar44 = (RALocalAllocator *)(ulong)uVar16;
            uVar17 = (uint)bVar5;
            uVar45 = (uint)bVar54;
            if (pRVar44 != (RALocalAllocator *)0xffffffff) {
              pRVar24 = *(RALocalAllocator **)&pRVar29->_pass;
              if (pRVar24[1]._curAssignment._layout.physIndex.super_RARegCount.field_0._packed <=
                  uVar16) goto LAB_00124d5b;
              RVar15 = (RegGroup)pRStack_408;
              pRVar27 = pRVar26;
              if ((uVar45 == 0xff) ||
                 (IVar6 = (pRStack_400->_archTraits->_instHints)._data[(long)pRStack_408],
                 pRVar27 = (RALocalAllocator *)
                           (CONCAT71((int7)((ulong)pRStack_400->_archTraits >> 8),IVar6) &
                           0xffffffffffffff01), (IVar6 & kRegSwap) == kNoHints)) {
                if (((ulong)pRStack_3b8 & 1) != 0) {
                  uVar18 = ~(((pRStack_400->_curAssignment)._physToWorkMap)->assigned)._masks._data
                            [(long)pRStack_408] &
                           (pRStack_400->_availableRegs)._masks._data[(long)pRStack_408];
                  if (uVar18 == 0) {
                    if (((((pRStack_400->_curAssignment)._physToWorkMap)->dirty)._masks._data
                         [(long)pRStack_408] >> (uVar17 & 0x1f) & 1) == 0) {
LAB_0012457b:
                      pcStack_418 = (code *)0x12458e;
                      pRVar39 = pRStack_3d0;
                      RAAssignment::unassign
                                ((RAAssignment *)pRStack_3d0,(RegGroup)pRStack_408,uVar16,uVar17);
                      pRVar24 = (RALocalAllocator *)0x0;
                    }
                    else {
                      pcStack_418 = (code *)0x124572;
                      pRVar39 = pRStack_400;
                      EVar20 = onSaveReg(pRStack_400,RVar15,uVar16,uVar17);
                      pRVar24 = (RALocalAllocator *)(ulong)EVar20;
                      if (EVar20 == 0) goto LAB_0012457b;
                    }
                    bVar55 = (int)pRVar24 != 0;
                    pRVar38 = (RALocalAllocator *)(ulong)bVar55;
                    pRVar27 = (RALocalAllocator *)(ulong)uStack_40c;
                    if (bVar55) {
                      pRVar27 = pRVar24;
                    }
                    uStack_40c = (uint)pRVar27;
                  }
                  else {
                    uVar16 = ~(pRStack_400->_funcPreservedRegs)._masks._data[(long)pRStack_408] &
                             uVar18;
                    if (uVar16 == 0) {
                      uVar16 = uVar18;
                    }
                    uVar18 = 0;
                    if (uVar16 != 0) {
                      for (; (uVar16 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    pRVar24 = (RALocalAllocator *)0x0;
                    if (uVar18 != uVar45) {
                      pRVar41 = (RALocalAllocator *)(ulong)uVar45;
                      pcStack_418 = (code *)0x124457;
                      RAAssignment::reassign
                                ((RAAssignment *)pRStack_3d0,RVar15,uVar42,uVar18,uVar45);
                      pRVar39 = *(RALocalAllocator **)&pRStack_400->_pass;
                      pcStack_418 = (code *)0x12446d;
                      pRVar24 = (RALocalAllocator *)
                                (**(code **)(*(long *)(((RARegMask *)&pRVar39->_pass)->_masks)._data
                                            + 0x48))(pRVar39,pRVar32,uVar18,bVar54);
                    }
                    pRVar38 = (RALocalAllocator *)0x1;
                    bVar55 = (int)pRVar24 != 0;
                    pRVar27 = (RALocalAllocator *)(ulong)uStack_40c;
                    if (bVar55) {
                      pRVar27 = (RALocalAllocator *)((ulong)pRVar24 & 0xffffffff);
                    }
                    uStack_40c = (uint)pRVar27;
                    if (!bVar55) {
                      pRVar27 = (RALocalAllocator *)(ulong)uVar18;
                      uVar16 = 1 << ((byte)uVar18 & 0x1f);
                      pRVar24 = (RALocalAllocator *)(ulong)uVar16;
                      puVar35 = (uint *)((long)((Array<unsigned_int_*,_4UL> *)
                                               &pRStack_400->_clobberedRegs)->_data +
                                        (long)pRStack_408 * 4);
                      *puVar35 = *puVar35 | uVar16;
                      pRVar38 = (RALocalAllocator *)0x23;
                    }
                  }
                }
              }
              else {
                uStack_3b0 = *(uint32_t **)
                              (*(long *)(pRVar24[1]._funcPreservedRegs._masks._data + 2) +
                              (long)pRVar44 * 8);
                pRVar43 = (RALocalAllocator *)(ulong)uVar18;
                pcStack_418 = (code *)0x1243bc;
                RAAssignment::swap((RAAssignment *)pRStack_3d0,RVar15,uVar42,uVar45,uVar16,uVar18);
                pRVar39 = *(RALocalAllocator **)&pRStack_400->_pass;
                pRVar41 = (RALocalAllocator *)(ulong)uVar18;
                pcStack_418 = (code *)0x1243d5;
                pRVar24 = (RALocalAllocator *)
                          (**(code **)(*(long *)(((RARegMask *)&pRVar39->_pass)->_masks)._data +
                                      0x50))(pRVar39,pRVar32,uVar45,pRVar44);
                pRVar38 = (RALocalAllocator *)0x1;
                bVar55 = (int)pRVar24 != 0;
                pRVar27 = (RALocalAllocator *)(ulong)uStack_40c;
                if (bVar55) {
                  pRVar27 = (RALocalAllocator *)((ulong)pRVar24 & 0xffffffff);
                }
                uStack_40c = (uint)pRVar27;
                if (!bVar55) {
                  uVar16 = *(uint *)((Array<unsigned_int_*,_4UL> *)&pRVar34->_cc)->_data;
                  *(uint *)((Array<unsigned_int_*,_4UL> *)&pRVar34->_cc)->_data = uVar16 | 0x100;
                  if ((uVar16 & 2) != 0) {
                    puVar35 = (((pRStack_400->_curAssignment)._physToWorkMap)->dirty)._masks._data +
                              (long)pRStack_408;
                    *puVar35 = *puVar35 | 1 << (bVar5 & 0x1f);
                  }
                  pRVar24 = (RALocalAllocator *)(ulong)((int)pRStack_3e0 - 1);
                  pRVar27 = pRStack_3f8;
                  pRVar29 = uStack_3e8;
                  do {
                    if ((((Layout *)&pRVar27->_pass)->physIndex).super_RARegCount.field_0._packed ==
                        *uStack_3b0) goto LAB_00124501;
                    pRVar27 = (RALocalAllocator *)((long)(pRVar27->_availableRegs)._masks._data + 8)
                    ;
                    pRVar29 = (RALocalAllocator *)((long)&pRVar29[-1]._tmpWorkToPhysMap + 7);
                  } while (pRVar29 != (RALocalAllocator *)0x0);
                  pRVar27 = (RALocalAllocator *)0x0;
LAB_00124501:
                  pRVar38 = (RALocalAllocator *)0x25;
                  if ((pRVar27 != (RALocalAllocator *)0x0) &&
                     (*(byte *)((long)&pRVar27->_cc + 6) == bVar54)) {
                    uVar16 = *(uint *)&pRVar27->_cc;
                    *(uint *)&pRVar27->_cc = uVar16 | 0x100;
                    if ((uVar16 & 2) != 0) {
                      pRVar27 = (RALocalAllocator *)(pRStack_400->_curAssignment)._physToWorkMap;
                      puVar35 = (uint *)((long)(&pRVar27->_availableRegs + -1) +
                                        (long)pRStack_408 * 4 + 8);
                      *puVar35 = *puVar35 | 1 << (bVar54 & 0x1f);
                    }
                    pRVar24 = (RALocalAllocator *)(ulong)((int)pRStack_3e0 - 2);
                  }
                  pRStack_3e0 = pRVar24;
                }
              }
              pRVar37 = pRStack_408;
              pRVar44 = pRStack_3f8;
              pRVar29 = pRStack_400;
              if ((int)pRVar38 != 0) goto LAB_0012466a;
            }
            if (bVar54 == 0xff) {
              pRVar41 = (RALocalAllocator *)0x0;
              pcStack_418 = (code *)0x1245fe;
              RAAssignment::assign
                        ((RAAssignment *)pRStack_3d0,(RegGroup)pRStack_408,uVar42,uVar17,false);
              pRVar39 = *(RALocalAllocator **)&pRVar29->_pass;
              pcStack_418 = (code *)0x12460d;
              pRVar24 = (RALocalAllocator *)
                        (**(code **)(*(long *)(((RARegMask *)&pRVar39->_pass)->_masks)._data + 0x58)
                        )(pRVar39,pRVar32,uVar17);
            }
            else {
              pRVar41 = (RALocalAllocator *)(ulong)uVar45;
              pcStack_418 = (code *)0x1245d8;
              RAAssignment::reassign
                        ((RAAssignment *)pRStack_3d0,(RegGroup)pRStack_408,uVar42,uVar17,uVar45);
              pRVar39 = *(RALocalAllocator **)&pRVar29->_pass;
              pcStack_418 = (code *)0x1245ea;
              pRVar24 = (RALocalAllocator *)
                        (**(code **)(*(long *)(((RARegMask *)&pRVar39->_pass)->_masks)._data + 0x48)
                        )(pRVar39,pRVar32,uVar17,uVar45);
            }
            pRVar38 = (RALocalAllocator *)0x1;
            bVar55 = (int)pRVar24 == 0;
            pRVar27 = (RALocalAllocator *)(ulong)uStack_40c;
            if (!bVar55) {
              pRVar27 = (RALocalAllocator *)((ulong)pRVar24 & 0xffffffff);
            }
            uStack_40c = (uint)pRVar27;
            pRVar37 = pRStack_408;
            pRVar44 = pRStack_3f8;
            if (bVar55) {
              uVar42 = *(uint *)((Array<unsigned_int_*,_4UL> *)&pRVar34->_cc)->_data;
              uVar16 = uVar42 | 0x100;
              pRVar27 = (RALocalAllocator *)(ulong)uVar16;
              *(uint *)((Array<unsigned_int_*,_4UL> *)&pRVar34->_cc)->_data = uVar16;
              if ((uVar42 & 2) != 0) {
                pRVar27 = (RALocalAllocator *)(pRVar29->_curAssignment)._physToWorkMap;
                puVar35 = (uint *)((long)(&pRVar27->_availableRegs + -1) + (long)pRStack_408 * 4 + 8
                                  );
                *puVar35 = *puVar35 | 1 << (bVar5 & 0x1f);
              }
              pRVar24 = (RALocalAllocator *)(ulong)((int)pRStack_3e0 - 1);
              pRStack_3e0 = pRVar24;
              pRVar38 = (RALocalAllocator *)0x0;
            }
          }
LAB_0012466a:
          iVar36 = (int)pRVar38;
          if ((iVar36 != 0) && (iVar36 != 0x25)) {
            if (iVar36 != 0x23) {
              pRStack_3c8 = (RALocalAllocator *)CONCAT44(pRStack_3c8._4_4_,(int)pRStack_3e0);
              pRVar24 = pRVar43;
              unaff_R15 = pRVar51;
              goto LAB_001246a9;
            }
            break;
          }
          pRVar47 = (RALocalAllocator *)
                    ((long)&(((Layout *)&pRVar47->_pass)->physIndex).super_RARegCount.field_0 + 1);
        } while (pRVar47 != uStack_3e8);
      }
      pRStack_3b8 = (RALocalAllocator *)
                    CONCAT44(pRStack_3b8._4_4_,
                             (int)CONCAT71((int7)((ulong)pRVar24 >> 8),
                                           (int)pRStack_3c8 == (int)pRStack_3e0));
      pRVar38 = (RALocalAllocator *)0x0;
      pRStack_3c8 = (RALocalAllocator *)CONCAT44(pRStack_3c8._4_4_,(int)pRStack_3e0);
      pRVar27 = pRStack_3e0;
      pRVar24 = pRVar43;
      unaff_R15 = pRVar51;
LAB_001246a9:
      if ((int)pRVar38 != 0) goto LAB_001246d1;
      pRVar43 = pRVar24;
      pRVar51 = unaff_R15;
    } while ((int)pRStack_3c8 != 0);
    pRVar38 = (RALocalAllocator *)0x0;
LAB_001246d1:
    if ((int)pRVar38 != 0) goto LAB_00124d0e;
  }
  if (uStack_3d4 != 0) {
    unaff_R15 = (RALocalAllocator *)(ulong)uStack_3d4;
    pRVar29 = (RALocalAllocator *)0x0;
    pRVar34 = (RALocalAllocator *)(ulong)uStack_3d4;
    pRVar48 = (RALocalAllocator *)(ulong)uStack_3bc;
    while( true ) {
      pRVar43 = (RALocalAllocator *)auStack_340[(long)pRVar29];
      uVar42 = (((Layout *)&pRVar43->_pass)->physIndex).super_RARegCount.field_0._packed;
      if ((ulong)uVar42 == 0xffffffff) goto LAB_00124d7e;
      pRVar26 = pRVar27;
      if ((pRStack_400->_curAssignment)._layout.workCount <= uVar42) break;
      bVar54 = (pRStack_400->_curAssignment)._workToPhysMap[uVar42].physIds[0];
      pRVar32 = (RALocalAllocator *)(ulong)bVar54;
      uVar16 = (uint)bVar54;
      if (uVar16 != 0xff) {
        pRVar38 = (RALocalAllocator *)((ulong)pRStack_408 & 0xff);
        pRVar27 = (RALocalAllocator *)(ulong)uVar16;
        pcStack_418 = (code *)0x124737;
        pRVar39 = pRStack_3d0;
        RAAssignment::unassign((RAAssignment *)pRStack_3d0,(RegGroup)pRStack_408,uVar42,uVar16);
        pRVar48 = (RALocalAllocator *)(ulong)((uint)pRVar48 & ~(1 << (bVar54 & 0x1f)));
      }
      pRVar34 = (RALocalAllocator *)
                (ulong)((int)pRVar34 + -1 + (uint)((*(uint *)&pRVar43->_cc >> 3 & 1) != 0));
      pRVar29 = (RALocalAllocator *)
                ((long)&(((Layout *)&pRVar29->_pass)->physIndex).super_RARegCount.field_0._packed +
                1);
      if (unaff_R15 == pRVar29) goto LAB_00124757;
    }
    goto LAB_00124d83;
  }
  pRVar34 = (RALocalAllocator *)0x0;
  pRVar48 = (RALocalAllocator *)(ulong)uStack_3bc;
  pRVar43 = pRVar26;
LAB_00124757:
  pRVar29 = pRStack_400;
  pRVar37 = pRStack_408;
  if ((int)pRVar48 != 0) {
    do {
      uVar42 = 0;
      uVar16 = (uint)pRVar48;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
        }
      }
      uVar18 = (pRVar29->_curAssignment)._physToWorkIds._data[(long)pRVar37][uVar42];
      unaff_R15 = (RALocalAllocator *)(ulong)uVar18;
      if (uVar18 == 0xffffffff) {
        pRVar38 = (RALocalAllocator *)0x38;
      }
      else {
        if (((((pRVar29->_curAssignment)._physToWorkMap)->dirty)._masks._data[(long)pRVar37] >>
             (uVar42 & 0x1f) & 1) == 0) {
LAB_001247a4:
          pcStack_418 = (code *)0x1247b6;
          pRVar39 = pRStack_3d0;
          RAAssignment::unassign((RAAssignment *)pRStack_3d0,(RegGroup)pRVar37,uVar18,uVar42);
          uVar17 = 0;
        }
        else {
          pcStack_418 = (code *)0x12479b;
          pRVar39 = pRVar29;
          uVar17 = onSaveReg(pRVar29,(RegGroup)pRVar37,uVar18,uVar42);
          pRVar37 = pRStack_408;
          if (uVar17 == 0) goto LAB_001247a4;
        }
        pRVar38 = (RALocalAllocator *)(ulong)(uVar17 != 0);
        if (uVar17 != 0) {
          uStack_40c = uVar17;
        }
        pRVar27 = (RALocalAllocator *)(ulong)uStack_40c;
        pRVar37 = pRStack_408;
      }
      if (((int)pRVar38 != 0x38) && ((int)pRVar38 != 0)) goto LAB_001247f2;
      uVar16 = uVar16 - 1 & uVar16;
      pRVar48 = (RALocalAllocator *)(ulong)uVar16;
    } while (uVar16 != 0);
    pRVar38 = (RALocalAllocator *)0x0;
LAB_001247f2:
    if ((int)pRVar38 != 0) goto LAB_00124d0e;
  }
  if ((int)uStack_3a8 != 0) {
    uVar30 = (ulong)uStack_3a8 & 0xffffffff;
    uVar40 = 0;
    do {
      puVar35 = (uint *)auStack_240[uVar40];
      pRVar43 = (RALocalAllocator *)(ulong)puVar35[4];
      if (puVar35[4] != 0) {
        uVar42 = *puVar35;
        bVar54 = *(byte *)((long)puVar35 + 0xe);
        unaff_R15 = (RALocalAllocator *)(ulong)bVar54;
        do {
          uVar16 = 0;
          uVar18 = (uint)pRVar43;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
          if (uVar16 != bVar54) {
            pRVar39 = *(RALocalAllocator **)&pRStack_400->_pass;
            pRVar38 = (RALocalAllocator *)(ulong)uVar42;
            pRVar27 = (RALocalAllocator *)(ulong)(uint)bVar54;
            pcStack_418 = (code *)0x12483c;
            (**(code **)(*(long *)(((RARegMask *)&pRVar39->_pass)->_masks)._data + 0x48))();
          }
          uVar18 = uVar18 - 1 & uVar18;
          pRVar43 = (RALocalAllocator *)(ulong)uVar18;
        } while (uVar18 != 0);
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != uVar30);
  }
  pRVar37 = pRStack_408;
  if ((pRStack_408 != (RALocalAllocator *)0x1) ||
     (pRVar27 = pRStack_350, *(char *)&pRStack_350->_archTraits != '\x12')) {
LAB_00124959:
    uStack_3bc = uStack_3bc | uStack_3ec;
    pRVar44 = pRStack_400;
    if ((int)pRVar34 == 0) {
LAB_00124d03:
      puVar35 = (uint *)((long)((Array<unsigned_int_*,_4UL> *)&pRVar44->_clobberedRegs)->_data +
                        (long)pRVar37 * 4);
      *puVar35 = *puVar35 | uStack_3bc;
      pRVar38 = (RALocalAllocator *)0x0;
      pRVar29 = pRVar44;
      goto LAB_00124d0e;
    }
    uVar42 = (((pRStack_400->_curAssignment)._physToWorkMap)->assigned)._masks._data[(long)pRVar37];
    pRVar38 = (RALocalAllocator *)(ulong)uVar42;
    iVar36 = (int)pRStack_398;
    pRStack_3f8 = (RALocalAllocator *)CONCAT44(pRStack_3f8._4_4_,uVar42);
    pRVar48 = pRStack_398;
    if (iVar36 != 0) {
      pRVar27 = (RALocalAllocator *)CONCAT71((int7)((ulong)pRVar27 >> 8),1);
      if ((*(uint32_t *)(auStack_380._16_8_ + 8) & 0x800) != 0) {
        uVar42 = ((Array<asmjit::v1_14::OperandSignature,_32UL> *)(auStack_380._16_8_ + 0x14))->
                 _data[0]._bits;
        if (uVar42 == 0) {
          unaff_R15 = (RALocalAllocator *)0xffffffff;
        }
        else {
          uVar16 = *(uint *)((long)(pRStack_400->_availableRegs)._masks._data + (long)pRVar37 * 4);
          pRVar38 = (RALocalAllocator *)(ulong)uVar16;
          pRVar39 = *(RALocalAllocator **)&pRStack_400->_pass;
          pRVar41 = (RALocalAllocator *)((ulong)pRStack_398 & 0xffffffff);
          pRVar24 = (RALocalAllocator *)0x0;
          unaff_R15 = (RALocalAllocator *)0xffffffff;
          uVar18 = uVar42;
          do {
            uVar17 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            if ((uVar42 >> (uVar17 & 0x1f) & 1) != 0) {
              uVar45 = (uint)unaff_R15;
              uStack_3e8 = (RALocalAllocator *)CONCAT44(uStack_3e8._4_4_,uVar45);
              pRVar26 = (RALocalAllocator *)(ulong)uVar17;
              pRVar32 = (RALocalAllocator *)0xf;
              unaff_R15 = (RALocalAllocator *)(auStack_380 + 0x10);
              pRVar48 = (RALocalAllocator *)0x1;
              do {
                uVar46 = 1 << ((byte)pRVar26 & 0x1f) & uVar16;
                pRVar29 = (RALocalAllocator *)(ulong)uVar46;
                if (uVar46 == 0) {
                  pRVar32 = (RALocalAllocator *)0x0;
                }
                else {
                  pRVar43 = (RALocalAllocator *)(ulong)**(uint **)&unaff_R15->_pass;
                  if (pRVar39[1]._curAssignment._layout.physIndex.super_RARegCount.field_0._packed
                      <= **(uint **)&unaff_R15->_pass) goto LAB_00124d88;
                  bVar55 = pRVar26 ==
                           (RALocalAllocator *)
                           (ulong)*(byte *)(*(long *)(*(long *)(pRVar39[1]._funcPreservedRegs._masks
                                                                ._data + 2) + (long)pRVar43 * 8) +
                                           0x4a);
                  pRVar43 = (RALocalAllocator *)(ulong)bVar55;
                  pRVar32 = (RALocalAllocator *)(ulong)((int)pRVar32 + (uint)bVar55);
                  pRVar37 = pRStack_408;
                }
                if (uVar46 == 0) break;
                unaff_R15 = (RALocalAllocator *)&unaff_R15->_cc;
                pRVar26 = (RALocalAllocator *)
                          ((long)&(((Layout *)&pRVar26->_pass)->physIndex).super_RARegCount.field_0.
                                  _packed + 1);
                bVar55 = pRVar48 < pRVar41;
                pRVar37 = pRStack_408;
                pRVar48 = (RALocalAllocator *)
                          ((long)&(((Layout *)&pRVar48->_pass)->physIndex).super_RARegCount.field_0
                          + 1);
              } while (bVar55);
              if ((uint)pRVar24 < (uint)pRVar32) {
                uVar45 = uVar17;
                pRVar24 = pRVar32;
              }
              unaff_R15 = (RALocalAllocator *)(ulong)uVar45;
            }
            uVar18 = uVar18 - 1 & uVar18;
            pRVar27 = (RALocalAllocator *)(ulong)uVar18;
          } while (uVar18 != 0);
        }
        iVar49 = (int)unaff_R15;
        pRVar27 = (RALocalAllocator *)CONCAT71((int7)((ulong)pRVar27 >> 8),iVar49 != -1);
        if (iVar49 == -1) {
          uStack_40c = 0x3d;
          pRVar48 = pRStack_398;
        }
        else {
          pRVar48 = (RALocalAllocator *)(ulong)(iVar36 + (uint)(iVar36 == 0));
          lVar21 = 0;
          do {
            uVar42 = iVar49 + (int)lVar21;
            pRVar39 = (RALocalAllocator *)(ulong)uVar42;
            *(char *)(*(long *)(auStack_380 + lVar21 * 8 + 0x10) + 0xf) = (char)uVar42;
            lVar21 = lVar21 + 1;
            pRVar37 = pRStack_408;
          } while (pRVar48 != (RALocalAllocator *)lVar21);
        }
      }
      pRVar38 = (RALocalAllocator *)0x1;
      if ((char)pRVar27 != '\0') goto LAB_00124ade;
LAB_00124cff:
      pRVar29 = pRVar44;
      if ((int)pRVar38 != 0) goto LAB_00124d0e;
      goto LAB_00124d03;
    }
LAB_00124ade:
    pRVar26 = (RALocalAllocator *)(ulong)uStack_3d4;
    if (uStack_3d4 != 0) {
      pRVar43 = (RALocalAllocator *)0x0;
      uStack_3e8 = (RALocalAllocator *)((ulong)uStack_3e8._4_4_ << 0x20);
      uStack_3a8 = pRVar26;
      pRVar32 = pRVar26;
      while( true ) {
        pRVar48 = (RALocalAllocator *)auStack_340[(long)pRVar43];
        uVar42 = *(uint *)((Array<unsigned_int_*,_4UL> *)&pRVar48->_cc)->_data;
        pRVar29 = (RALocalAllocator *)(ulong)uVar42;
        pRVar38 = (RALocalAllocator *)0x4e;
        pRVar44 = pRStack_400;
        if ((uVar42 & 8) != 0) break;
LAB_00124cbe:
        if (((int)pRVar38 != 0x4e) && ((int)pRVar38 != 0)) goto LAB_00124cff;
        pRVar43 = (RALocalAllocator *)
                  ((long)&(((Layout *)&pRVar43->_pass)->physIndex).super_RARegCount.field_0._packed
                  + 1);
        if (pRVar26 == pRVar43) {
          bVar55 = (int)pRVar34 == 0;
          pRVar27 = pRVar26;
          pRVar26 = pRVar32;
          pRVar29 = pRVar44;
          goto LAB_00124ce8;
        }
      }
      uVar16 = (((Layout *)&pRVar48->_pass)->physIndex).super_RARegCount.field_0._packed;
      pRVar32 = (RALocalAllocator *)(ulong)uVar16;
      if (pRVar32 == (RALocalAllocator *)0xffffffff) goto LAB_00124da6;
      if ((pRStack_400->_curAssignment)._layout.workCount <= uVar16) goto LAB_00124dab;
      bVar54 = (pRStack_400->_curAssignment)._workToPhysMap[(long)pRVar32].physIds[0];
      pRVar28 = (RALocalAllocator *)(ulong)bVar54;
      if (bVar54 != 0xff) {
        pRVar38 = (RALocalAllocator *)((ulong)pRVar37 & 0xff);
        pcStack_418 = (code *)0x124b57;
        pRVar39 = pRStack_3d0;
        RAAssignment::unassign((RAAssignment *)pRStack_3d0,(RegGroup)pRVar37,uVar16,(uint)bVar54);
        pRVar37 = pRStack_408;
      }
      pRVar29 = pRStack_400;
      bVar54 = *(byte *)((long)((Array<unsigned_int_*,_4UL> *)&pRVar48->_cc)->_data + 7);
      unaff_R15 = (RALocalAllocator *)(ulong)bVar54;
      pRVar27 = unaff_R15;
      if (bVar54 != 0xff) {
LAB_00124c4e:
        uVar42 = (uint)pRVar27;
        pRVar26 = pRVar28;
        unaff_R15 = pRVar27;
        if (0x1f < uVar42) goto LAB_00124db0;
        pRVar13 = &pRVar29->_curAssignment;
        uVar18 = 1 << ((byte)pRVar27 & 0x1f);
        pRVar29 = (RALocalAllocator *)(ulong)uVar18;
        if (((pRVar13->_physToWorkMap->assigned)._masks._data[(long)pRVar37] >> (uVar42 & 0x1f) & 1)
            == 0) {
          if (((ulong)((Array<unsigned_int_*,_4UL> *)&pRVar48->_cc)->_data[0] & 0x40000) == 0) {
            pRVar41 = (RALocalAllocator *)0x1;
            pcStack_418 = (code *)0x124c95;
            pRVar39 = pRStack_3d0;
            RAAssignment::assign((RAAssignment *)pRStack_3d0,(RegGroup)pRVar37,uVar16,uVar42,true);
            pRVar37 = pRStack_408;
          }
          *(byte *)((long)((Array<unsigned_int_*,_4UL> *)&pRVar48->_cc)->_data + 7) = (byte)pRVar27;
          pbVar2 = (byte *)((long)((Array<unsigned_int_*,_4UL> *)&pRVar48->_cc)->_data + 1);
          *pbVar2 = *pbVar2 | 2;
          uStack_3e8 = (RALocalAllocator *)CONCAT44(uStack_3e8._4_4_,(uint)uStack_3e8 | uVar18);
          pRStack_3f8 = (RALocalAllocator *)CONCAT44(pRStack_3f8._4_4_,(uint)pRStack_3f8 & ~uVar18);
          pRVar34 = (RALocalAllocator *)(ulong)((int)pRVar34 - 1);
          pRVar38 = (RALocalAllocator *)0x0;
          pRVar26 = uStack_3a8;
          pRVar44 = pRStack_400;
          goto LAB_00124cbe;
        }
        goto LAB_00124db5;
      }
      uVar42 = ~((int)(short)uVar42 >> 0xf & uStack_3ec | (uint)uStack_3e8) &
               *(uint *)((long)&pRVar48->_archTraits + 4);
      uVar40 = (ulong)uVar42;
      uVar18 = ~(uint)pRStack_3f8 & uVar42;
      pRVar41 = (RALocalAllocator *)(ulong)uVar18;
      pRVar39 = pRStack_400;
      if (uVar18 != 0) {
        pcStack_418 = (code *)0x124baa;
        uVar19 = decideOnAssignment(pRStack_400,(RegGroup)pRVar37,uVar16,uVar42,uVar18);
        unaff_R15 = (RALocalAllocator *)(ulong)uVar19;
        pRVar28 = (RALocalAllocator *)CONCAT71((int7)(uVar40 >> 8),1);
LAB_00124c40:
        pRVar38 = (RALocalAllocator *)0x1;
        pRVar26 = uStack_3a8;
        pRVar37 = pRStack_408;
        pRVar44 = pRVar29;
        pRVar27 = unaff_R15;
        if ((char)pRVar28 == '\0') goto LAB_00124cbe;
        goto LAB_00124c4e;
      }
      pRVar27 = (RALocalAllocator *)(ulong)(uVar42 & (uint)pRStack_3f8);
      pRVar38 = (RALocalAllocator *)((ulong)pRVar37 & 0xff);
      pRStack_3e0 = (RALocalAllocator *)CONCAT44(pRStack_3e0._4_4_,(int)pRVar38);
      pRVar41 = (RALocalAllocator *)auStack_380;
      pcStack_418 = (code *)0x124bd2;
      uVar19 = decideOnSpillFor(pRStack_400,(RegGroup)pRVar37,(uint32_t)pRVar37,
                                uVar42 & (uint)pRStack_3f8,(uint32_t *)pRVar41);
      workId = auStack_380._0_4_;
      if (uVar19 < 0x20) {
        unaff_R15 = (RALocalAllocator *)(ulong)uVar19;
        RVar15 = (RegGroup)pRStack_3e0;
        if (((((pRVar29->_curAssignment)._physToWorkMap)->dirty)._masks._data[(long)pRStack_408] >>
             (uVar19 & 0x1f) & 1) == 0) {
LAB_00124c1c:
          pcStack_418 = (code *)0x124c29;
          pRVar29 = unaff_R15;
          pRVar39 = pRStack_3d0;
          RAAssignment::unassign((RAAssignment *)pRStack_3d0,RVar15,workId,uVar19);
          uVar42 = 0;
        }
        else {
          pRVar29 = (RALocalAllocator *)(ulong)uVar19;
          pcStack_418 = (code *)0x124c11;
          pRVar39 = pRStack_400;
          uVar42 = onSaveReg(pRStack_400,RVar15,auStack_380._0_4_,uVar19);
          RVar15 = (RegGroup)pRStack_3e0;
          if (uVar42 == 0) goto LAB_00124c1c;
        }
        pRVar28 = (RALocalAllocator *)CONCAT71((int7)((ulong)pRVar29 >> 8),uVar42 == 0);
        if (uVar42 != 0) {
          uStack_40c = uVar42;
        }
        pRVar29 = pRStack_400;
        goto LAB_00124c40;
      }
      goto LAB_00124dba;
    }
    bVar55 = false;
    uStack_3e8 = (RALocalAllocator *)((ulong)uStack_3e8._4_4_ << 0x20);
    pRVar29 = pRStack_400;
LAB_00124ce8:
    pRVar34 = (RALocalAllocator *)0x0;
    pRVar32 = pRVar26;
    if (bVar55) {
      uStack_3bc = uStack_3bc | (uint)uStack_3e8;
      pRVar38 = (RALocalAllocator *)0x0;
      pRVar44 = pRVar29;
      goto LAB_00124cff;
    }
    goto LAB_00124dbf;
  }
  uVar42 = (((pRStack_400->_curAssignment)._physToWorkMap)->assigned)._masks._data[1] &
           *(uint *)&(pRStack_350->_tmpAssignment)._workToPhysMap;
  if (uVar42 != 0) {
    bVar54 = *(byte *)((long)(pRStack_350->_curAssignment)._physToWorkIds._data + 0x1d);
    pRVar29 = (RALocalAllocator *)(ulong)bVar54;
    do {
      pRVar48 = (RALocalAllocator *)(ulong)uVar42;
      uVar16 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
      pRVar28 = (RALocalAllocator *)(ulong)uVar16;
      uVar18 = (pRStack_400->_curAssignment)._physToWorkIds._data[(long)pRVar37][(long)pRVar28];
      unaff_R15 = (RALocalAllocator *)(ulong)uVar18;
      pRVar26 = pRStack_400;
      if (*(uint *)&pRStack_400->_pass->field_0x148 <= uVar18) goto LAB_00124d9c;
      pRVar27 = (RALocalAllocator *)CONCAT71((int7)((ulong)pRStack_400 >> 8),1);
      if ((uint)bVar54 <
          *(uint *)(*(long *)(*(long *)(*(long *)&pRStack_400->_pass->_workRegs +
                                       (long)unaff_R15 * 8) + 8) + 8)) {
        if (((((pRStack_400->_curAssignment)._physToWorkMap)->dirty)._masks._data[(long)pRVar37] >>
             (uVar16 & 0x1f) & 1) == 0) {
LAB_001248f9:
          pRVar38 = (RALocalAllocator *)0x1;
          pcStack_418 = (code *)0x12490d;
          pRVar39 = pRStack_3d0;
          RAAssignment::unassign((RAAssignment *)pRStack_3d0,kVec,uVar18,uVar16);
          uVar17 = 0;
          pRVar26 = pRVar28;
        }
        else {
          pRVar38 = (RALocalAllocator *)0x1;
          pRVar26 = (RALocalAllocator *)(ulong)uVar16;
          pcStack_418 = (code *)0x1248f5;
          pRVar39 = pRStack_400;
          uVar17 = onSaveReg(pRStack_400,kVec,uVar18,uVar16);
          if (uVar17 == 0) goto LAB_001248f9;
        }
        pRVar27 = (RALocalAllocator *)CONCAT71((int7)((ulong)pRVar26 >> 8),uVar17 == 0);
        if (uVar17 != 0) {
          uStack_40c = uVar17;
        }
        pRVar37 = pRStack_408;
      }
      if ((char)pRVar27 == '\0') {
        pRVar27 = (RALocalAllocator *)0x0;
        goto LAB_00124947;
      }
      uVar42 = uVar42 - 1 & uVar42;
      if (uVar42 == 0) goto LAB_00124947;
    } while( true );
  }
  pRVar27 = (RALocalAllocator *)CONCAT71((int7)((ulong)pRStack_350 >> 8),1);
LAB_00124947:
  pRVar38 = (RALocalAllocator *)0x1;
  pRVar29 = pRStack_400;
  if ((char)pRVar27 == '\0') goto LAB_00124d0e;
  goto LAB_00124959;
LAB_00124d0e:
  iVar36 = (int)pRVar38;
  if (iVar36 != 0) goto LAB_00124d24;
  pRStack_408 = (RALocalAllocator *)
                ((long)&(((Layout *)&pRVar37->_pass)->physIndex).super_RARegCount.field_0._packed +
                1);
  if (pRStack_408 == (RALocalAllocator *)0x4) {
    iVar36 = 2;
LAB_00124d24:
    if (iVar36 == 2) {
      uStack_40c = 0;
    }
    return uStack_40c;
  }
  goto LAB_0012378e;
  while( true ) {
    puVar35 = puVar35 + 8;
    uVar30 = uVar30 - 1;
    if (uVar30 == 0) break;
LAB_00124e97:
    if (*puVar35 == extraout_EDX_00) goto LAB_00124eab;
  }
LAB_00124ea9:
  puVar35 = (uint *)0x0;
LAB_00124eab:
  if ((puVar35 == (uint *)0x0) || ((puVar35[2] & 0x40008) == 0)) {
    if ((*(byte *)(lVar21 + 0x24) & 4) == 0) {
      uVar16 = ~*(uint *)(lVar21 + 0x38) & uVar16;
      if (uVar16 != 0) {
        uVar42 = ~(pRVar39->_funcPreservedRegs)._masks._data[uVar40] & uVar16;
        if (uVar42 == 0) {
          uVar42 = uVar16;
        }
        EVar20 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> EVar20 & 1) == 0; EVar20 = EVar20 + 1) {
          }
        }
      }
      if (uVar16 != 0) {
        return EVar20;
      }
    }
    EVar20 = 0xff;
  }
  else {
    EVar20 = 0;
    if (uVar16 != 0) {
      for (; (uVar16 >> EVar20 & 1) == 0; EVar20 = EVar20 + 1) {
      }
    }
  }
  return EVar20;
LAB_00124d47:
  pcStack_418 = (code *)0x124d4c;
  allocInst();
LAB_00124d4c:
  pcStack_418 = (code *)0x124d51;
  allocInst();
LAB_00124d51:
  pcStack_418 = (code *)0x124d56;
  allocInst();
  pRVar44 = pRVar29;
  pRVar48 = pRVar26;
LAB_00124d56:
  pRVar26 = pRVar27;
  pcStack_418 = (code *)0x124d5b;
  allocInst();
LAB_00124d5b:
  pcStack_418 = (code *)0x124d60;
  allocInst();
  pRVar28 = pRVar32;
  pRVar24 = pRVar43;
  pRVar29 = pRVar44;
  pRVar43 = pRVar48;
  unaff_R15 = pRVar51;
LAB_00124d60:
  pcStack_418 = (code *)0x124d65;
  allocInst();
LAB_00124d65:
  pcStack_418 = (code *)0x124d6a;
  allocInst();
LAB_00124d6a:
  pcStack_418 = (code *)0x124d6f;
  allocInst();
  pRVar27 = pRVar26;
  pRVar32 = pRVar28;
  pRVar48 = pRVar47;
LAB_00124d6f:
  pcStack_418 = (code *)0x124d74;
  allocInst();
LAB_00124d74:
  pcStack_418 = (code *)0x124d79;
  allocInst();
LAB_00124d79:
  pcStack_418 = (code *)0x124d7e;
  allocInst();
LAB_00124d7e:
  pcStack_418 = (code *)0x124d83;
  allocInst();
  pRVar26 = pRVar27;
LAB_00124d83:
  pcStack_418 = (code *)0x124d88;
  allocInst();
LAB_00124d88:
  pcStack_418 = (code *)0x124d8d;
  allocInst();
  pRVar28 = pRVar32;
LAB_00124d8d:
  pcStack_418 = (code *)0x124d92;
  allocInst();
LAB_00124d92:
  pcStack_418 = (code *)0x124d97;
  allocInst();
LAB_00124d97:
  pcStack_418 = (code *)0x124d9c;
  allocInst();
LAB_00124d9c:
  pcStack_418 = (code *)0x124da1;
  allocInst();
  pRVar32 = pRVar28;
LAB_00124da1:
  pcStack_418 = (code *)0x124da6;
  allocInst();
LAB_00124da6:
  pcStack_418 = (code *)0x124dab;
  allocInst();
LAB_00124dab:
  pcStack_418 = (code *)0x124db0;
  allocInst();
LAB_00124db0:
  pRVar27 = pRVar26;
  pcStack_418 = (code *)0x124db5;
  allocInst();
LAB_00124db5:
  pcStack_418 = (code *)0x124dba;
  allocInst();
LAB_00124dba:
  pcStack_418 = (code *)0x124dbf;
  allocInst();
LAB_00124dbf:
  pcStack_418 = decideOnAssignment;
  allocInst();
  pcStack_418 = (code *)extraout_RAX;
  uVar42 = (uint)pRVar41;
  if (uVar42 == 0) {
    pcStack_420 = (code *)0x124e1c;
    decideOnAssignment();
LAB_00124e1c:
    pcStack_420 = (code *)0x124e21;
    decideOnAssignment();
  }
  else {
    lVar21 = *(long *)(((RARegMask *)&pRVar39->_pass)->_masks)._data;
    if (*(uint *)(lVar21 + 0x148) <= extraout_EDX) goto LAB_00124e1c;
    pRVar27 = *(RALocalAllocator **)(*(long *)(lVar21 + 0x140) + (ulong)extraout_EDX * 8);
    bVar54 = (pRVar27->_curAssignment)._layout.physIndex.super_RARegCount.field_0._regs[2];
    if ((bVar54 != 0xff) && ((uVar42 >> (bVar54 & 0x1f) & 1) != 0)) {
      return (uint)bVar54;
    }
    if ((byte)pRVar38 < 4) {
      uVar16 = (pRVar27->_funcPreservedRegs)._masks._data[1] & uVar42;
      if (uVar16 == 0) {
        uVar16 = uVar42;
      }
      uVar42 = ~(pRVar39->_funcPreservedRegs)._masks._data[(ulong)pRVar38 & 0xff] & uVar16;
      if (uVar42 == 0) {
        uVar42 = uVar16;
      }
      EVar20 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> EVar20 & 1) == 0; EVar20 = EVar20 + 1) {
        }
      }
      return EVar20;
    }
  }
  uVar42 = (uint)pRVar27;
  pcStack_420 = decideOnReassignment;
  decideOnAssignment();
  pcStack_420 = (code *)extraout_RAX_00;
  uVar16 = (uint)pRVar41;
  if (uVar16 == 0) {
    pRStack_428 = (RALocalAllocator *)0x124ef1;
    decideOnReassignment();
  }
  else {
    lVar21 = *(long *)(((RARegMask *)&pRVar39->_pass)->_masks)._data;
    if (extraout_EDX_00 < *(uint *)(lVar21 + 0x148)) {
      lVar21 = *(long *)(*(long *)(lVar21 + 0x140) + (ulong)extraout_EDX_00 * 8);
      bVar54 = *(byte *)(lVar21 + 0x4a);
      if ((bVar54 != 0xff) && ((uVar16 >> (bVar54 & 0x1f) & 1) != 0)) {
        return (uint)bVar54;
      }
      uVar42 = extraout_EDX_00;
      if ((byte)pRVar38 < 4) {
        uVar40 = (ulong)pRVar38 & 0xff;
        EVar20 = (Error)uVar40;
        uVar30 = (ulong)*(byte *)((long)(pRVar24->_availableRegs)._masks._data + uVar40);
        if (uVar30 == 0) goto LAB_00124ea9;
        puVar35 = (uint *)((long)(pRVar24->_curAssignment)._physToWorkIds._data +
                          ((ulong)((*(uint *)((long)&pRVar24->_archTraits + 4) >>
                                    ((byte)pRVar38 * '\b' & 0x1f) & 0xff) << 5) - 0x24));
        goto LAB_00124e97;
      }
      goto LAB_00124ef6;
    }
  }
  pRStack_428 = (RALocalAllocator *)0x124ef6;
  decideOnReassignment();
LAB_00124ef6:
  pRStack_428 = (RALocalAllocator *)0x124efb;
  decideOnReassignment();
  pRStack_428 = pRVar34;
  pRStack_430 = unaff_R15;
  pRStack_438 = pRVar48;
  pRStack_440 = pRVar29;
  pRStack_448 = pRVar32;
  if (uVar42 == 0) goto LAB_00124fda;
  if (3 < (byte)pRVar38) goto LAB_00124fdf;
  uVar16 = 0;
  if (uVar42 != 0) {
    for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
    }
  }
  uVar40 = (ulong)pRVar38 & 0xff;
  pRVar38 = (RALocalAllocator *)(pRVar39->_curAssignment)._physToWorkIds._data[uVar40];
  uVar18 = *(uint *)((long)(pRVar38->_availableRegs)._masks._data + ((ulong)uVar16 - 6) * 4);
  pRVar24 = (RALocalAllocator *)(ulong)uVar18;
  uVar42 = uVar42 - 1 & uVar42;
  if (uVar42 != 0) {
    lVar21 = *(long *)(((RARegMask *)&pRVar39->_pass)->_masks)._data;
    uVar17 = *(uint *)(lVar21 + 0x148);
    if (uVar17 <= uVar18) {
LAB_00124fe4:
      pRStack_450 = (RALocalAllocator *)0x124fe9;
      decideOnSpillFor();
      pRStack_450 = pRVar34;
      pRStack_458 = unaff_R15;
      pRStack_460 = pRVar48;
      pRStack_468 = pRVar43;
      pRStack_470 = pRVar29;
      pRStack_478 = pRVar32;
      pRStack_480 = pRVar38;
      pPVar33 = *(PhysToWorkMap **)((long)(pRVar38->_availableRegs)._masks._data + 8);
      node_00 = (InstNode *)(ulong)(pPVar33->dirty)._masks._data[0];
      if (node_00 != (InstNode *)0x0) {
        pRStack_490 = (RALocalAllocator *)&pRVar39->_curAssignment;
        puVar35 = pPVar33[2].assigned._masks._data + 3;
        pIVar52 = (InstNode *)0x0;
        pIStack_488 = node_00;
        pRVar41 = pRVar39;
        do {
          if ((InstNode *)(ulong)(pPVar33->dirty)._masks._data[0] <= pIVar52) {
            puStack_4a8 = (uint *)0x125140;
            spillAfterAllocation();
LAB_00125140:
            puStack_4a8 = (uint *)0x125145;
            spillAfterAllocation();
LAB_00125145:
            puStack_4a8 = (uint *)0x12514a;
            spillAfterAllocation();
LAB_0012514a:
            puStack_4a8 = (uint *)0x12514f;
            spillAfterAllocation();
LAB_0012514f:
            puStack_4a8 = (uint *)0x125154;
            spillAfterAllocation();
LAB_00125154:
            puStack_4a8 = (uint *)0x125159;
            spillAfterAllocation();
            puStack_4a8 = puVar35;
            pIStack_4b0 = pIVar52;
            pRStack_4b8 = pRVar39;
            pRStack_4c0 = pRVar43;
            pRStack_4c8 = pRVar29;
            pPStack_4d0 = pPVar33;
            (pRVar41->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node_00;
            if (*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) {
              EVar20 = switchToAssignment(pRVar41,*(PhysToWorkMap **)(block + 200),
                                          (ZoneBitVector *)(block + 0x78),
                                          SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true);
              pPVar33 = (PhysToWorkMap *)(ulong)EVar20;
              if (EVar20 != 0) {
                return EVar20;
              }
            }
            EVar20 = allocInst(pRVar41,node_00);
            if (EVar20 != 0) {
              return EVar20;
            }
            uVar42 = *(uint *)(block + 0xb8);
            if ((ulong)uVar42 == 0xffffffff) {
              pRVar25 = block + 0xbc;
LAB_001251fe:
              EVar20 = spillScratchGpRegsBeforeEntry(pRVar41,*(RegMask *)pRVar25);
              if (EVar20 != 0) {
                return EVar20;
              }
              if (*(long *)(block + 200) == 0) {
                EVar20 = BaseRAPass::setBlockEntryAssignment
                                   (pRVar41->_pass,block,pRVar41->_block,&pRVar41->_curAssignment);
                if (EVar20 != 0) {
                  return EVar20;
                }
                goto LAB_001253c0;
              }
              node = *(BaseNode **)pRVar41->_pass->_extraBlock;
              pRVar25 = (RABlock *)BaseBuilder::setCursor(&pRVar41->_cc->super_BaseBuilder,node);
              pWVar7 = (pRVar41->_curAssignment)._workToPhysMap;
              memcpy((pRVar41->_tmpAssignment)._physToWorkMap,
                     (pRVar41->_curAssignment)._physToWorkMap,
                     (ulong)(pRVar41->_tmpAssignment)._layout.physTotal * 4 + 0x20);
              memcpy((pRVar41->_tmpAssignment)._workToPhysMap,pWVar7,
                     (ulong)(pRVar41->_tmpAssignment)._layout.workCount);
              bVar55 = false;
              EVar20 = switchToAssignment(pRVar41,*(PhysToWorkMap **)(block + 200),
                                          (ZoneBitVector *)(block + 0x78),
                                          SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
              if (EVar20 != 0) goto LAB_001253bb;
              EVar20 = (Error)pPVar33;
              if ((pRVar41->_cc->super_BaseBuilder)._cursor != node) {
                if ((uint)(byte)node_00[0x13] <= (byte)node_00[0x12] - 1) goto LAB_001253d8;
                lVar21 = (ulong)((byte)node_00[0x12] - 1) * 0x10;
                if ((*(uint *)(node_00 + lVar21 + 0x40) & 7) != 5) goto LAB_001253dd;
                (*(pRVar41->_cc->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])
                          (&uStack_4f8);
                uStack_4e8 = *(undefined8 *)(node_00 + lVar21 + 0x40);
                uStack_4e0 = *(undefined8 *)(node_00 + lVar21 + 0x48);
                *(undefined4 *)(node_00 + lVar21 + 0x40) = uStack_4f8;
                *(undefined4 *)(node_00 + lVar21 + 0x44) = uStack_4f4;
                *(undefined4 *)(node_00 + lVar21 + 0x48) = uStack_4f0;
                *(undefined4 *)(node_00 + lVar21 + 0x4c) = uStack_4ec;
                node_00[0x34] = (InstNode)((byte)node_00[0x34] & 0xef);
                EVar20 = (*(pRVar41->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
                bVar55 = EVar20 == 0;
                if (bVar55) {
                  pBVar8 = pRVar41->_cc;
                  (pBVar8->super_BaseBuilder)._cursor = node;
                  (*(pBVar8->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                            (pBVar8,&uStack_4f8);
                  EVar20 = (Error)pPVar33;
                }
                goto LAB_00125340;
              }
            }
            else {
              if (uVar42 < *(uint *)(*(long *)block + 0xf0)) {
                pRVar25 = (RABlock *)((ulong)uVar42 * 0x20 + *(long *)(*(long *)block + 0xe8));
                goto LAB_001251fe;
              }
              allocBranch();
              pRVar25 = block;
LAB_001253d8:
              allocBranch();
LAB_001253dd:
              EVar20 = 3;
              bVar55 = false;
LAB_00125340:
              if (!bVar55) {
                bVar55 = false;
                goto LAB_001253bb;
              }
            }
            (pRVar41->_cc->super_BaseBuilder)._cursor = (BaseNode *)pRVar25;
            pWVar7 = (pRVar41->_curAssignment)._workToPhysMap;
            pPVar33 = (pRVar41->_curAssignment)._physToWorkMap;
            pPVar9 = (pRVar41->_tmpAssignment)._physToWorkMap;
            (pRVar41->_curAssignment)._workToPhysMap = (pRVar41->_tmpAssignment)._workToPhysMap;
            (pRVar41->_curAssignment)._physToWorkMap = pPVar9;
            (pRVar41->_tmpAssignment)._workToPhysMap = pWVar7;
            (pRVar41->_tmpAssignment)._physToWorkMap = pPVar33;
            lVar21 = 0;
            do {
              ppuVar3 = (pRVar41->_curAssignment)._physToWorkIds._data + lVar21;
              puVar35 = *ppuVar3;
              puVar10 = ppuVar3[1];
              ppuVar4 = (pRVar41->_tmpAssignment)._physToWorkIds._data + lVar21;
              puVar11 = ppuVar4[1];
              ppuVar3 = (pRVar41->_curAssignment)._physToWorkIds._data + lVar21;
              *ppuVar3 = *ppuVar4;
              ppuVar3[1] = puVar11;
              ppuVar3 = (pRVar41->_tmpAssignment)._physToWorkIds._data + lVar21;
              *ppuVar3 = puVar35;
              ppuVar3[1] = puVar10;
              lVar21 = lVar21 + 2;
            } while (lVar21 != 4);
            bVar55 = true;
LAB_001253bb:
            if (bVar55) {
LAB_001253c0:
              EVar20 = 0;
            }
            return EVar20;
          }
          bVar55 = true;
          if ((*puVar35 & 0x20000) != 0) {
            uVar42 = puVar35[-2];
            pRVar29 = (RALocalAllocator *)(ulong)uVar42;
            if (*(uint *)&pRVar39->_pass->field_0x148 <= uVar42) goto LAB_00125140;
            lVar21 = *(long *)(*(long *)&pRVar39->_pass->_workRegs + (long)pRVar29 * 8);
            if (*(char *)(lVar21 + 0x4a) != -1) goto LAB_00125110;
            if (uVar42 == 0xffffffff) goto LAB_00125145;
            if ((pRVar39->_curAssignment)._layout.workCount <= uVar42) goto LAB_0012514a;
            bVar54 = (pRVar39->_curAssignment)._workToPhysMap[(long)pRVar29].physIds[0];
            pRVar43 = (RALocalAllocator *)(ulong)bVar54;
            if (bVar54 == 0xff) goto LAB_00125110;
            RVar15 = *(RegGroup *)(lVar21 + 0x21);
            (pRVar39->_cc->super_BaseBuilder)._cursor = (BaseNode *)pRStack_480;
            if (0x1f < bVar54) goto LAB_0012514f;
            RVar15 = RVar15 & kMaxValue;
            if (kExtraVirt3 < RVar15) goto LAB_00125154;
            if (((((pRVar39->_curAssignment)._physToWorkMap)->dirty)._masks._data[RVar15] >>
                 (bVar54 & 0x1f) & 1) == 0) {
LAB_001250e9:
              puStack_4a8 = (uint *)0x1250f9;
              pRVar41 = pRStack_490;
              RAAssignment::unassign((RAAssignment *)pRStack_490,RVar15,uVar42,(uint)bVar54);
              EVar20 = 0;
            }
            else {
              puStack_4a8 = (uint *)0x1250e0;
              pRVar41 = pRVar39;
              uStack_498 = (ulong)RVar15;
              EVar20 = onSaveReg(pRVar39,RVar15,uVar42,(uint)bVar54);
              RVar15 = (RegGroup)uStack_498;
              if (EVar20 == 0) goto LAB_001250e9;
            }
            bVar55 = EVar20 == 0;
            if (!bVar55) {
              EStack_49c = EVar20;
            }
            node_00 = pIStack_488;
          }
LAB_00125110:
          if (!bVar55) {
            return EStack_49c;
          }
          pIVar52 = pIVar52 + 1;
          puVar35 = puVar35 + 8;
        } while (node_00 != pIVar52);
      }
      return 0;
    }
    lVar21 = *(long *)(lVar21 + 0x140);
    uVar46 = (uint)(*(float *)(*(long *)(lVar21 + (long)pRVar24 * 8) + 100) * 1048576.0);
    uVar45 = (((pRVar39->_curAssignment)._physToWorkMap)->dirty)._masks._data[uVar40];
    pRVar39 = (RALocalAllocator *)(ulong)uVar45;
    uVar18 = uVar46 + 0x40000;
    if ((uVar45 >> (uVar16 & 0x1f) & 1) == 0) {
      uVar18 = uVar46;
    }
    pRVar26 = (RALocalAllocator *)(ulong)uVar18;
    do {
      uVar46 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
        }
      }
      pRVar32 = (RALocalAllocator *)(ulong)uVar46;
      uVar18 = *(uint *)((long)(pRVar38->_availableRegs)._masks._data +
                        (long)((long)&pRVar32[-1]._tmpWorkToPhysMap + 2) * 4);
      pRVar48 = (RALocalAllocator *)(ulong)uVar18;
      if (uVar17 <= uVar18) {
        pRStack_450 = (RALocalAllocator *)0x124fda;
        decideOnSpillFor();
LAB_00124fda:
        pRStack_450 = (RALocalAllocator *)0x124fdf;
        decideOnSpillFor();
LAB_00124fdf:
        pRStack_450 = (RALocalAllocator *)0x124fe4;
        decideOnSpillFor();
        goto LAB_00124fe4;
      }
      uVar18 = (uint)(*(float *)(*(long *)(lVar21 + (long)pRVar48 * 8) + 100) * 1048576.0);
      unaff_R15 = (RALocalAllocator *)(ulong)uVar18;
      pRVar29 = (RALocalAllocator *)(ulong)(uVar18 + 0x40000);
      if ((uVar45 >> (uVar46 & 0x1f) & 1) == 0) {
        pRVar29 = unaff_R15;
      }
      bVar55 = (uint)pRVar29 < (uint)pRVar26;
      if (bVar55) {
        pRVar24 = pRVar48;
        pRVar26 = pRVar29;
      }
      uVar18 = (uint)pRVar24;
      if (bVar55) {
        uVar16 = uVar46;
      }
      uVar42 = uVar42 - 1 & uVar42;
      pRVar34 = (RALocalAllocator *)(ulong)uVar42;
    } while (uVar42 != 0);
  }
  (((Layout *)&pRVar41->_pass)->physIndex).super_RARegCount.field_0._packed = uVar18;
  return uVar16;
}

Assistant:

Error RALocalAllocator::replaceAssignment(const PhysToWorkMap* physToWorkMap) noexcept {
  _curAssignment.copyFrom(physToWorkMap);
  return kErrorOk;
}